

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_tagliatelle_2021.h
# Opt level: O0

void __thiscall Tagliatelle<UF>::FirstScan(Tagliatelle<UF> *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uchar *puVar8;
  uint *puVar9;
  uint *puVar10;
  uchar *puVar11;
  uchar *puVar12;
  int local_bc;
  int c_3;
  uint *img_labels_row_prev_prev_1;
  uint *img_labels_row_3;
  uchar *img_row_prev_prev_1;
  uchar *img_row_prev_1;
  uchar *img_row_3;
  int r_3;
  int c_2;
  uint *img_labels_row_prev_prev;
  uint *img_labels_row_2;
  uchar *img_row_fol_1;
  uchar *img_row_prev_prev;
  uchar *img_row_prev;
  uchar *img_row_2;
  int r_2;
  int c_1;
  uint *img_labels_row_1;
  uchar *img_row_fol;
  uchar *img_row_1;
  int r_1;
  int c;
  uint *img_labels_row;
  uchar *img_row;
  int r;
  int w;
  int h;
  Tagliatelle<UF> *this_local;
  
  uVar6 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  uVar1 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = uVar6 & 0xfffffffe;
  this->o_rows = (int)uVar6 % 2 == 1;
  this->e_cols = uVar1 & 0xfffffffe;
  this->o_cols = (int)uVar1 % 2 == 1;
  UF::Setup();
  if (uVar6 != 1) {
    puVar8 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
    lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar9 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,0);
    img_row_2._4_4_ = -2;
LAB_0032460e:
    iVar5 = img_row_2._4_4_ + 2;
    if (iVar5 < (int)(uVar1 - 2)) {
      if (puVar8[iVar5] == '\0') {
        if (puVar8[iVar5 + lVar2] == '\0') {
          if (puVar8[img_row_2._4_4_ + 3] == '\0') {
            if (puVar8[(img_row_2._4_4_ + 3) + lVar2] == '\0') {
              puVar9[iVar5] = 0;
              img_row_2._4_4_ = iVar5;
              goto LAB_0032460e;
            }
            uVar7 = UF::NewLabel();
            puVar9[iVar5] = uVar7;
            img_row_2._4_4_ = iVar5;
          }
          else {
            uVar7 = UF::NewLabel();
            puVar9[iVar5] = uVar7;
            img_row_2._4_4_ = iVar5;
          }
        }
        else {
          if (puVar8[img_row_2._4_4_ + 3] == '\0') {
            uVar7 = UF::NewLabel();
            puVar9[iVar5] = uVar7;
            img_row_2._4_4_ = iVar5;
            goto LAB_003248a7;
          }
          uVar7 = UF::NewLabel();
          puVar9[iVar5] = uVar7;
          img_row_2._4_4_ = iVar5;
        }
      }
      else {
        if (puVar8[img_row_2._4_4_ + 3] == '\0') {
          uVar7 = UF::NewLabel();
          puVar9[iVar5] = uVar7;
          img_row_2._4_4_ = iVar5;
          goto LAB_003248a7;
        }
        uVar7 = UF::NewLabel();
        puVar9[iVar5] = uVar7;
        img_row_2._4_4_ = iVar5;
      }
LAB_00324747:
      do {
        iVar5 = img_row_2._4_4_ + 2;
        if ((int)(uVar1 - 2) <= iVar5) {
          if ((int)(uVar1 - 2) < iVar5) {
            if (puVar8[iVar5] == '\0') {
              if (puVar8[iVar5 + lVar2] == '\0') {
                puVar9[iVar5] = 0;
              }
              else {
                puVar9[iVar5] = puVar9[img_row_2._4_4_];
              }
            }
            else {
              puVar9[iVar5] = puVar9[img_row_2._4_4_];
            }
          }
          else if (puVar8[iVar5] == '\0') {
            if (puVar8[iVar5 + lVar2] == '\0') {
              if (puVar8[img_row_2._4_4_ + 3] == '\0') {
                if (puVar8[(img_row_2._4_4_ + 3) + lVar2] == '\0') {
                  puVar9[iVar5] = 0;
                }
                else {
                  uVar7 = UF::NewLabel();
                  puVar9[iVar5] = uVar7;
                }
              }
              else {
                uVar7 = UF::NewLabel();
                puVar9[iVar5] = uVar7;
              }
            }
            else if (puVar8[img_row_2._4_4_ + 3] == '\0') {
              puVar9[iVar5] = puVar9[img_row_2._4_4_];
            }
            else {
              puVar9[iVar5] = puVar9[img_row_2._4_4_];
            }
          }
          else if (puVar8[img_row_2._4_4_ + 3] == '\0') {
            puVar9[iVar5] = puVar9[img_row_2._4_4_];
          }
          else {
            puVar9[iVar5] = puVar9[img_row_2._4_4_];
          }
          goto LAB_00325087;
        }
        if (puVar8[iVar5] == '\0') {
          if (puVar8[iVar5 + lVar2] == '\0') {
            if (puVar8[img_row_2._4_4_ + 3] == '\0') {
              if (puVar8[(img_row_2._4_4_ + 3) + lVar2] == '\0') {
                puVar9[iVar5] = 0;
                img_row_2._4_4_ = iVar5;
                goto LAB_0032460e;
              }
              uVar7 = UF::NewLabel();
              puVar9[iVar5] = uVar7;
              img_row_2._4_4_ = iVar5;
            }
            else {
              uVar7 = UF::NewLabel();
              puVar9[iVar5] = uVar7;
              img_row_2._4_4_ = iVar5;
            }
          }
          else if (puVar8[img_row_2._4_4_ + 3] == '\0') {
            puVar9[iVar5] = puVar9[img_row_2._4_4_];
            img_row_2._4_4_ = iVar5;
LAB_003248a7:
            while( true ) {
              while( true ) {
                while( true ) {
                  iVar5 = img_row_2._4_4_ + 2;
                  if ((int)(uVar1 - 2) <= iVar5) {
                    if ((int)(uVar1 - 2) < iVar5) {
                      if (puVar8[iVar5] == '\0') {
                        if (puVar8[iVar5 + lVar2] == '\0') {
                          puVar9[iVar5] = 0;
                        }
                        else if (puVar8[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
                          uVar7 = UF::NewLabel();
                          puVar9[iVar5] = uVar7;
                        }
                        else {
                          puVar9[iVar5] = puVar9[img_row_2._4_4_];
                        }
                      }
                      else if (puVar8[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
                        uVar7 = UF::NewLabel();
                        puVar9[iVar5] = uVar7;
                      }
                      else {
                        puVar9[iVar5] = puVar9[img_row_2._4_4_];
                      }
                    }
                    else if (puVar8[iVar5] == '\0') {
                      if (puVar8[iVar5 + lVar2] == '\0') {
                        if (puVar8[img_row_2._4_4_ + 3] == '\0') {
                          if (puVar8[(img_row_2._4_4_ + 3) + lVar2] == '\0') {
                            puVar9[iVar5] = 0;
                          }
                          else {
                            uVar7 = UF::NewLabel();
                            puVar9[iVar5] = uVar7;
                          }
                        }
                        else {
                          uVar7 = UF::NewLabel();
                          puVar9[iVar5] = uVar7;
                        }
                      }
                      else if (puVar8[img_row_2._4_4_ + 3] == '\0') {
                        if (puVar8[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
                          uVar7 = UF::NewLabel();
                          puVar9[iVar5] = uVar7;
                        }
                        else {
                          puVar9[iVar5] = puVar9[img_row_2._4_4_];
                        }
                      }
                      else if (puVar8[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
                        uVar7 = UF::NewLabel();
                        puVar9[iVar5] = uVar7;
                      }
                      else {
                        puVar9[iVar5] = puVar9[img_row_2._4_4_];
                      }
                    }
                    else if (puVar8[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
                      if (puVar8[img_row_2._4_4_ + 3] == '\0') {
                        uVar7 = UF::NewLabel();
                        puVar9[iVar5] = uVar7;
                      }
                      else {
                        uVar7 = UF::NewLabel();
                        puVar9[iVar5] = uVar7;
                      }
                    }
                    else if (puVar8[img_row_2._4_4_ + 3] == '\0') {
                      puVar9[iVar5] = puVar9[img_row_2._4_4_];
                    }
                    else {
                      puVar9[iVar5] = puVar9[img_row_2._4_4_];
                    }
                    goto LAB_00325087;
                  }
                  if (puVar8[iVar5] != '\0') break;
                  if (puVar8[iVar5 + lVar2] == '\0') {
                    if (puVar8[img_row_2._4_4_ + 3] != '\0') {
                      uVar7 = UF::NewLabel();
                      puVar9[iVar5] = uVar7;
                      img_row_2._4_4_ = iVar5;
                      goto LAB_00324747;
                    }
                    if (puVar8[(img_row_2._4_4_ + 3) + lVar2] == '\0') {
                      puVar9[iVar5] = 0;
                      img_row_2._4_4_ = iVar5;
                      goto LAB_0032460e;
                    }
                    uVar7 = UF::NewLabel();
                    puVar9[iVar5] = uVar7;
                    img_row_2._4_4_ = iVar5;
                    goto LAB_00324747;
                  }
                  if (puVar8[img_row_2._4_4_ + 3] != '\0') {
                    if (puVar8[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
                      uVar7 = UF::NewLabel();
                      puVar9[iVar5] = uVar7;
                      img_row_2._4_4_ = iVar5;
                    }
                    else {
                      puVar9[iVar5] = puVar9[img_row_2._4_4_];
                      img_row_2._4_4_ = iVar5;
                    }
                    goto LAB_00324747;
                  }
                  if (puVar8[(img_row_2._4_4_ + 1) + lVar2] == '\0') {
                    uVar7 = UF::NewLabel();
                    puVar9[iVar5] = uVar7;
                    img_row_2._4_4_ = iVar5;
                  }
                  else {
                    puVar9[iVar5] = puVar9[img_row_2._4_4_];
                    img_row_2._4_4_ = iVar5;
                  }
                }
                if (puVar8[(img_row_2._4_4_ + 1) + lVar2] == '\0') break;
                if (puVar8[img_row_2._4_4_ + 3] != '\0') {
                  puVar9[iVar5] = puVar9[img_row_2._4_4_];
                  img_row_2._4_4_ = iVar5;
                  goto LAB_00324747;
                }
                puVar9[iVar5] = puVar9[img_row_2._4_4_];
                img_row_2._4_4_ = iVar5;
              }
              if (puVar8[img_row_2._4_4_ + 3] != '\0') break;
              uVar7 = UF::NewLabel();
              puVar9[iVar5] = uVar7;
              img_row_2._4_4_ = iVar5;
            }
            uVar7 = UF::NewLabel();
            puVar9[iVar5] = uVar7;
            img_row_2._4_4_ = iVar5;
          }
          else {
            puVar9[iVar5] = puVar9[img_row_2._4_4_];
            img_row_2._4_4_ = iVar5;
          }
        }
        else {
          if (puVar8[img_row_2._4_4_ + 3] == '\0') {
            puVar9[iVar5] = puVar9[img_row_2._4_4_];
            img_row_2._4_4_ = iVar5;
            goto LAB_003248a7;
          }
          puVar9[iVar5] = puVar9[img_row_2._4_4_];
          img_row_2._4_4_ = iVar5;
        }
      } while( true );
    }
    if ((int)(uVar1 - 2) < iVar5) {
      if (puVar8[iVar5] == '\0') {
        if (puVar8[iVar5 + lVar2] == '\0') {
          puVar9[iVar5] = 0;
        }
        else {
          uVar7 = UF::NewLabel();
          puVar9[iVar5] = uVar7;
        }
      }
      else {
        uVar7 = UF::NewLabel();
        puVar9[iVar5] = uVar7;
      }
    }
    else if (puVar8[iVar5] == '\0') {
      if (puVar8[iVar5 + lVar2] == '\0') {
        if (puVar8[img_row_2._4_4_ + 3] == '\0') {
          if (puVar8[(img_row_2._4_4_ + 3) + lVar2] == '\0') {
            puVar9[iVar5] = 0;
          }
          else {
            uVar7 = UF::NewLabel();
            puVar9[iVar5] = uVar7;
          }
        }
        else {
          uVar7 = UF::NewLabel();
          puVar9[iVar5] = uVar7;
        }
      }
      else if (puVar8[img_row_2._4_4_ + 3] == '\0') {
        uVar7 = UF::NewLabel();
        puVar9[iVar5] = uVar7;
      }
      else {
        uVar7 = UF::NewLabel();
        puVar9[iVar5] = uVar7;
      }
    }
    else if (puVar8[img_row_2._4_4_ + 3] == '\0') {
      uVar7 = UF::NewLabel();
      puVar9[iVar5] = uVar7;
    }
    else {
      uVar7 = UF::NewLabel();
      puVar9[iVar5] = uVar7;
    }
LAB_00325087:
    for (img_row_2._0_4_ = 2;
        (int)img_row_2 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74;
        img_row_2._0_4_ = (int)img_row_2 + 2) {
      puVar8 = cv::Mat::ptr<unsigned_char>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                          (int)img_row_2);
      puVar11 = puVar8 + -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                      field_0x48;
      lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      puVar12 = puVar8 + **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                     field_0x48;
      puVar9 = cv::Mat::ptr<unsigned_int>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           super_Mat,(int)img_row_2);
      puVar10 = (uint *)((long)puVar9 +
                        (-**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).
                                      img_labels_)->field_0x48 -
                        **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)
                                    ->field_0x48));
      img_row_3._4_4_ = 0;
      if ((int)(uVar1 - 2) < 1) {
        if ((int)(uVar1 - 2) < 0) {
          if (*puVar8 == '\0') {
            if (*puVar12 == '\0') {
              *puVar9 = 0;
            }
            else {
              uVar7 = UF::NewLabel();
              *puVar9 = uVar7;
            }
          }
          else if (*puVar11 == '\0') {
            uVar7 = UF::NewLabel();
            *puVar9 = uVar7;
          }
          else {
            *puVar9 = *puVar10;
          }
        }
        else if (*puVar8 == '\0') {
          if (*puVar12 == '\0') {
            if (puVar8[1] == '\0') {
              if (puVar12[1] == '\0') {
                *puVar9 = 0;
              }
              else {
                uVar7 = UF::NewLabel();
                *puVar9 = uVar7;
              }
            }
            else if (puVar11[1] == '\0') {
              if (*puVar11 == '\0') {
                uVar7 = UF::NewLabel();
                *puVar9 = uVar7;
              }
              else {
                *puVar9 = *puVar10;
              }
            }
            else {
              *puVar9 = *puVar10;
            }
          }
          else if (puVar8[1] == '\0') {
            uVar7 = UF::NewLabel();
            *puVar9 = uVar7;
          }
          else if (puVar11[1] == '\0') {
            if (*puVar11 == '\0') {
              uVar7 = UF::NewLabel();
              *puVar9 = uVar7;
            }
            else {
              *puVar9 = *puVar10;
            }
          }
          else {
            *puVar9 = *puVar10;
          }
        }
        else if (puVar11[1] == '\0') {
          if (*puVar11 == '\0') {
            uVar7 = UF::NewLabel();
            *puVar9 = uVar7;
          }
          else {
            *puVar9 = *puVar10;
          }
        }
        else {
          *puVar9 = *puVar10;
        }
      }
      else {
        if (*puVar8 == '\0') {
          if (*puVar12 == '\0') {
            if (puVar8[1] == '\0') {
              if (puVar12[1] == '\0') {
                *puVar9 = 0;
                goto LAB_003256b5;
              }
              uVar7 = UF::NewLabel();
              *puVar9 = uVar7;
              goto LAB_00325e4e;
            }
            if (puVar11[1] != '\0') {
              *puVar9 = *puVar10;
              goto LAB_003276e7;
            }
            if (puVar11[2] == '\0') {
              if (*puVar11 == '\0') {
                uVar7 = UF::NewLabel();
                *puVar9 = uVar7;
                goto LAB_00326811;
              }
              *puVar9 = *puVar10;
              goto LAB_00326c4a;
            }
            if (*puVar11 == '\0') {
              *puVar9 = puVar10[2];
              goto LAB_003272c8;
            }
            if (puVar11[1 - lVar2] == '\0') {
              uVar7 = UF::Merge(*puVar10,puVar10[2]);
              *puVar9 = uVar7;
              goto LAB_003272c8;
            }
            *puVar9 = *puVar10;
            goto LAB_003272c8;
          }
          if (puVar8[1] == '\0') {
            uVar7 = UF::NewLabel();
            *puVar9 = uVar7;
            goto LAB_00327dae;
          }
          if (puVar11[1] != '\0') {
            *puVar9 = *puVar10;
            goto LAB_003276e7;
          }
          if (puVar11[2] == '\0') {
            if (*puVar11 == '\0') {
              uVar7 = UF::NewLabel();
              *puVar9 = uVar7;
              goto LAB_00326811;
            }
            *puVar9 = *puVar10;
            goto LAB_00326c4a;
          }
          if (*puVar11 == '\0') {
            *puVar9 = puVar10[2];
            goto LAB_003272c8;
          }
          if (puVar11[1 - lVar2] == '\0') {
            uVar7 = UF::Merge(*puVar10,puVar10[2]);
            *puVar9 = uVar7;
            goto LAB_003272c8;
          }
          *puVar9 = *puVar10;
          goto LAB_003272c8;
        }
        if (puVar11[1] == '\0') {
          if (puVar8[1] == '\0') {
            if (*puVar11 == '\0') {
              uVar7 = UF::NewLabel();
              *puVar9 = uVar7;
              goto LAB_00329508;
            }
            *puVar9 = *puVar10;
            goto LAB_00329f45;
          }
          if (puVar11[2] == '\0') {
            if (*puVar11 == '\0') {
              uVar7 = UF::NewLabel();
              *puVar9 = uVar7;
              goto LAB_00326811;
            }
            *puVar9 = *puVar10;
            goto LAB_00326c4a;
          }
          if (*puVar11 == '\0') {
            *puVar9 = puVar10[2];
            goto LAB_003272c8;
          }
          if (puVar11[1 - lVar2] == '\0') {
            uVar7 = UF::Merge(*puVar10,puVar10[2]);
            *puVar9 = uVar7;
            goto LAB_003272c8;
          }
          *puVar9 = *puVar10;
          goto LAB_003272c8;
        }
        *puVar9 = *puVar10;
        img_row_3._4_4_ = 0;
LAB_0032ae39:
        iVar5 = img_row_3._4_4_ + 2;
        if (iVar5 < (int)(uVar1 - 2)) {
          if (puVar8[iVar5] == '\0') {
            if (puVar12[iVar5] == '\0') {
              if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                  puVar9[iVar5] = 0;
                  img_row_3._4_4_ = iVar5;
                  goto LAB_003256b5;
                }
                uVar7 = UF::NewLabel();
                puVar9[iVar5] = uVar7;
                img_row_3._4_4_ = iVar5;
                goto LAB_00325e4e;
              }
              if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                puVar9[iVar5] = puVar10[iVar5];
                img_row_3._4_4_ = iVar5;
                goto LAB_003276e7;
              }
              if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                if (puVar11[iVar5] == '\0') {
                  uVar7 = UF::NewLabel();
                  puVar9[iVar5] = uVar7;
                  img_row_3._4_4_ = iVar5;
                  goto LAB_00326811;
                }
                puVar9[iVar5] = puVar10[iVar5];
                img_row_3._4_4_ = iVar5;
                goto LAB_00326c4a;
              }
              if (puVar11[iVar5] == '\0') {
                puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                img_row_3._4_4_ = iVar5;
              }
              else if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                uVar7 = UF::Merge(puVar10[iVar5],puVar10[img_row_3._4_4_ + 4]);
                puVar9[iVar5] = uVar7;
                img_row_3._4_4_ = iVar5;
              }
              else {
                puVar9[iVar5] = puVar10[iVar5];
                img_row_3._4_4_ = iVar5;
              }
            }
            else {
              if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                if (puVar12[img_row_3._4_4_ + 1] != '\0') {
                  puVar9[iVar5] = puVar9[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
                  goto LAB_00327dae;
                }
                if (puVar8[img_row_3._4_4_ + 1] == '\0') {
                  uVar7 = UF::NewLabel();
                  puVar9[iVar5] = uVar7;
                  img_row_3._4_4_ = iVar5;
                  goto LAB_00327dae;
                }
                puVar9[iVar5] = puVar9[img_row_3._4_4_];
                img_row_3._4_4_ = iVar5;
                goto LAB_00327dae;
              }
              if (puVar8[img_row_3._4_4_ + 1] == '\0') {
                if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                  if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                    puVar9[iVar5] = puVar10[iVar5];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_003276e7;
                  }
                  if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                    if (puVar11[iVar5] == '\0') {
                      uVar7 = UF::NewLabel();
                      puVar9[iVar5] = uVar7;
                      img_row_3._4_4_ = iVar5;
                      goto LAB_00326811;
                    }
                    puVar9[iVar5] = puVar10[iVar5];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_00326c4a;
                  }
                  if (puVar11[iVar5] == '\0') {
                    puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                    img_row_3._4_4_ = iVar5;
                  }
                  else if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                    uVar7 = UF::Merge(puVar10[iVar5],puVar10[img_row_3._4_4_ + 4]);
                    puVar9[iVar5] = uVar7;
                    img_row_3._4_4_ = iVar5;
                  }
                  else {
                    puVar9[iVar5] = puVar10[iVar5];
                    img_row_3._4_4_ = iVar5;
                  }
                }
                else {
                  if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                    if (puVar11[iVar5] != '\0') {
                      puVar9[iVar5] = puVar10[img_row_3._4_4_];
                      img_row_3._4_4_ = iVar5;
                      goto LAB_003276e7;
                    }
                    if (puVar11[iVar5 - lVar2] == '\0') {
                      uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                      puVar9[iVar5] = uVar7;
                      img_row_3._4_4_ = iVar5;
                      goto LAB_003276e7;
                    }
                    puVar9[iVar5] = puVar10[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_003276e7;
                  }
                  if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                    if (puVar11[iVar5] == '\0') {
                      puVar9[iVar5] = puVar9[img_row_3._4_4_];
                      img_row_3._4_4_ = iVar5;
                      goto LAB_00326811;
                    }
                    puVar9[iVar5] = puVar10[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_00326c4a;
                  }
                  if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                    if (puVar11[iVar5] == '\0') {
                      uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],puVar9[img_row_3._4_4_]);
                      puVar9[iVar5] = uVar7;
                      img_row_3._4_4_ = iVar5;
                    }
                    else {
                      uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[img_row_3._4_4_ + 4]);
                      puVar9[iVar5] = uVar7;
                      img_row_3._4_4_ = iVar5;
                    }
                  }
                  else if (puVar11[iVar5] == '\0') {
                    if (puVar11[iVar5 - lVar2] == '\0') {
                      uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                      puVar9[iVar5] = uVar7;
                      img_row_3._4_4_ = iVar5;
                    }
                    else {
                      puVar9[iVar5] = puVar10[img_row_3._4_4_];
                      img_row_3._4_4_ = iVar5;
                    }
                  }
                  else {
                    puVar9[iVar5] = puVar10[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                  }
                }
              }
              else {
                if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                  if (puVar11[iVar5] != '\0') {
                    puVar9[iVar5] = puVar10[iVar5];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_003276e7;
                  }
                  if (puVar11[iVar5 - lVar2] == '\0') {
                    uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                    puVar9[iVar5] = uVar7;
                    img_row_3._4_4_ = iVar5;
                    goto LAB_003276e7;
                  }
                  puVar9[iVar5] = puVar10[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
                  goto LAB_003276e7;
                }
                if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                  puVar9[iVar5] = puVar9[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
                  goto LAB_00328d27;
                }
                if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                  uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],puVar9[img_row_3._4_4_]);
                  puVar9[iVar5] = uVar7;
                  img_row_3._4_4_ = iVar5;
                }
                else if (puVar11[iVar5] == '\0') {
                  if (puVar11[iVar5 - lVar2] == '\0') {
                    uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                    puVar9[iVar5] = uVar7;
                    img_row_3._4_4_ = iVar5;
                  }
                  else {
                    puVar9[iVar5] = puVar10[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                  }
                }
                else {
                  puVar9[iVar5] = puVar10[iVar5];
                  img_row_3._4_4_ = iVar5;
                }
              }
            }
LAB_003272c8:
            do {
              iVar5 = img_row_3._4_4_ + 2;
              if ((int)(uVar1 - 2) <= iVar5) {
                if ((int)(uVar1 - 2) < iVar5) {
LAB_0032d443:
                  img_row_3._4_4_ = iVar5;
                  if (puVar8[img_row_3._4_4_] == '\0') {
                    if (puVar12[img_row_3._4_4_] == '\0') {
                      puVar9[img_row_3._4_4_] = 0;
                    }
                    else {
                      puVar9[img_row_3._4_4_] = puVar9[img_row_3._4_4_ + -2];
                    }
                  }
                  else {
                    puVar9[img_row_3._4_4_] = puVar9[img_row_3._4_4_ + -2];
                  }
                }
                else if (puVar8[iVar5] == '\0') {
                  if (puVar12[iVar5] == '\0') {
                    if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                      if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                        puVar9[iVar5] = 0;
                      }
                      else {
                        uVar7 = UF::NewLabel();
                        puVar9[iVar5] = uVar7;
                      }
                    }
                    else {
                      puVar9[iVar5] = puVar10[iVar5];
                    }
                  }
                  else if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                    puVar9[iVar5] = puVar9[img_row_3._4_4_];
                  }
                  else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                    puVar9[iVar5] = puVar9[img_row_3._4_4_];
                  }
                  else {
                    puVar9[iVar5] = puVar10[iVar5];
                  }
                }
                else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                  puVar9[iVar5] = puVar9[img_row_3._4_4_];
                }
                else {
                  puVar9[iVar5] = puVar10[iVar5];
                }
                goto LAB_003316a4;
              }
              if (puVar8[iVar5] == '\0') {
                if (puVar12[iVar5] == '\0') {
                  if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                    if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                      puVar9[iVar5] = 0;
                      img_row_3._4_4_ = iVar5;
                      goto LAB_003256b5;
                    }
                    uVar7 = UF::NewLabel();
                    puVar9[iVar5] = uVar7;
                    img_row_3._4_4_ = iVar5;
                    goto LAB_00325e4e;
                  }
                  if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                    puVar9[iVar5] = puVar10[iVar5];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_003276e7;
                  }
                  if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                    puVar9[iVar5] = puVar10[iVar5];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_00326c4a;
                  }
                  if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                    uVar7 = UF::Merge(puVar10[iVar5],puVar10[img_row_3._4_4_ + 4]);
                    puVar9[iVar5] = uVar7;
                    img_row_3._4_4_ = iVar5;
                  }
                  else {
                    puVar9[iVar5] = puVar10[iVar5];
                    img_row_3._4_4_ = iVar5;
                  }
                }
                else {
                  if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                    puVar9[iVar5] = puVar9[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_00327dae;
                  }
                  if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                    puVar9[iVar5] = puVar10[iVar5];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_003276e7;
                  }
                  if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                    puVar9[iVar5] = puVar9[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_00328d27;
                  }
                  if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],puVar9[img_row_3._4_4_]);
                    puVar9[iVar5] = uVar7;
                    img_row_3._4_4_ = iVar5;
                  }
                  else {
                    puVar9[iVar5] = puVar10[iVar5];
                    img_row_3._4_4_ = iVar5;
                  }
                }
              }
              else {
                if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                  puVar9[iVar5] = puVar10[iVar5];
                  img_row_3._4_4_ = iVar5;
                  goto LAB_0032ae39;
                }
                if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                  puVar9[iVar5] = puVar9[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
                  goto LAB_0032bf50;
                }
                if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                  puVar9[iVar5] = puVar9[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
LAB_00328d27:
                  do {
                    iVar5 = img_row_3._4_4_ + 2;
                    if ((int)(uVar1 - 2) <= iVar5) {
                      if ((int)(uVar1 - 2) < iVar5) goto LAB_0032d443;
                      if (puVar8[iVar5] == '\0') {
                        if (puVar12[iVar5] == '\0') {
                          if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                            if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                              puVar9[iVar5] = 0;
                            }
                            else {
                              uVar7 = UF::NewLabel();
                              puVar9[iVar5] = uVar7;
                            }
                          }
                          else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                            uVar7 = UF::NewLabel();
                            puVar9[iVar5] = uVar7;
                          }
                          else {
                            puVar9[iVar5] = puVar10[iVar5];
                          }
                        }
                        else if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                          puVar9[iVar5] = puVar9[img_row_3._4_4_];
                        }
                        else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                          puVar9[iVar5] = puVar9[img_row_3._4_4_];
                        }
                        else if (puVar11[iVar5 - lVar2] == '\0') {
                          uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                          puVar9[iVar5] = uVar7;
                        }
                        else if (puVar11[img_row_3._4_4_] == '\0') {
                          uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                          puVar9[iVar5] = uVar7;
                        }
                        else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                          puVar9[iVar5] = uVar7;
                        }
                        else {
                          puVar9[iVar5] = puVar10[img_row_3._4_4_];
                        }
                      }
                      else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                        puVar9[iVar5] = puVar9[img_row_3._4_4_];
                      }
                      else if (puVar11[iVar5 - lVar2] == '\0') {
                        uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                        puVar9[iVar5] = uVar7;
                      }
                      else if (puVar11[img_row_3._4_4_] == '\0') {
                        uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                        puVar9[iVar5] = uVar7;
                      }
                      else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                        uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                        puVar9[iVar5] = uVar7;
                      }
                      else {
                        puVar9[iVar5] = puVar10[img_row_3._4_4_];
                      }
                      goto LAB_003316a4;
                    }
                    if (puVar8[iVar5] == '\0') {
                      if (puVar12[iVar5] == '\0') {
                        if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                          if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                            puVar9[iVar5] = 0;
                            img_row_3._4_4_ = iVar5;
                            goto LAB_003256b5;
                          }
                          uVar7 = UF::NewLabel();
                          puVar9[iVar5] = uVar7;
                          img_row_3._4_4_ = iVar5;
                          goto LAB_00325e4e;
                        }
                        if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                          if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                            uVar7 = UF::NewLabel();
                            puVar9[iVar5] = uVar7;
                            img_row_3._4_4_ = iVar5;
                            goto LAB_00326811;
                          }
                          puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                          img_row_3._4_4_ = iVar5;
                          goto LAB_003272c8;
                        }
                        puVar9[iVar5] = puVar10[iVar5];
                        img_row_3._4_4_ = iVar5;
                      }
                      else {
                        if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                          puVar9[iVar5] = puVar9[img_row_3._4_4_];
                          img_row_3._4_4_ = iVar5;
                          goto LAB_00327dae;
                        }
                        if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                          if (puVar11[img_row_3._4_4_ + 4] != '\0') {
                            if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                              uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],puVar9[img_row_3._4_4_]
                                               );
                              puVar9[iVar5] = uVar7;
                              img_row_3._4_4_ = iVar5;
                            }
                            else if (puVar11[iVar5 - lVar2] == '\0') {
                              uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                              puVar9[iVar5] = uVar7;
                              img_row_3._4_4_ = iVar5;
                            }
                            else if (puVar11[img_row_3._4_4_] == '\0') {
                              uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                              puVar9[iVar5] = uVar7;
                              img_row_3._4_4_ = iVar5;
                            }
                            else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                              uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                              puVar9[iVar5] = uVar7;
                              img_row_3._4_4_ = iVar5;
                            }
                            else {
                              puVar9[iVar5] = puVar10[img_row_3._4_4_];
                              img_row_3._4_4_ = iVar5;
                            }
                            goto LAB_003272c8;
                          }
                          puVar9[iVar5] = puVar9[img_row_3._4_4_];
                          img_row_3._4_4_ = iVar5;
                          goto LAB_00328d27;
                        }
                        if (puVar11[iVar5 - lVar2] == '\0') {
                          uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                          puVar9[iVar5] = uVar7;
                          img_row_3._4_4_ = iVar5;
                        }
                        else if (puVar11[img_row_3._4_4_] == '\0') {
                          uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                          puVar9[iVar5] = uVar7;
                          img_row_3._4_4_ = iVar5;
                        }
                        else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                          puVar9[iVar5] = uVar7;
                          img_row_3._4_4_ = iVar5;
                        }
                        else {
                          puVar9[iVar5] = puVar10[img_row_3._4_4_];
                          img_row_3._4_4_ = iVar5;
                        }
                      }
LAB_003276e7:
                      do {
                        iVar5 = img_row_3._4_4_ + 2;
                        if ((int)(uVar1 - 2) <= iVar5) {
                          if ((int)(uVar1 - 2) < iVar5) goto LAB_0032d443;
                          if (puVar8[iVar5] == '\0') {
                            if (puVar12[iVar5] == '\0') {
                              if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                                  puVar9[iVar5] = 0;
                                }
                                else {
                                  uVar7 = UF::NewLabel();
                                  puVar9[iVar5] = uVar7;
                                }
                              }
                              else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                if (puVar11[iVar5] == '\0') {
                                  uVar7 = UF::NewLabel();
                                  puVar9[iVar5] = uVar7;
                                }
                                else {
                                  puVar9[iVar5] = puVar10[iVar5];
                                }
                              }
                              else {
                                puVar9[iVar5] = puVar10[iVar5];
                              }
                            }
                            else if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                              puVar9[iVar5] = puVar9[img_row_3._4_4_];
                            }
                            else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                              puVar9[iVar5] = puVar9[img_row_3._4_4_];
                            }
                            else if (puVar11[iVar5] == '\0') {
                              if (puVar11[iVar5 - lVar2] == '\0') {
                                uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                puVar9[iVar5] = uVar7;
                              }
                              else {
                                puVar9[iVar5] = puVar10[img_row_3._4_4_];
                              }
                            }
                            else {
                              puVar9[iVar5] = puVar10[iVar5];
                            }
                          }
                          else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                            puVar9[iVar5] = puVar9[img_row_3._4_4_];
                          }
                          else if (puVar11[iVar5] == '\0') {
                            if (puVar11[iVar5 - lVar2] == '\0') {
                              uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                              puVar9[iVar5] = uVar7;
                            }
                            else {
                              puVar9[iVar5] = puVar10[img_row_3._4_4_];
                            }
                          }
                          else {
                            puVar9[iVar5] = puVar10[iVar5];
                          }
                          goto LAB_003316a4;
                        }
                        if (puVar8[iVar5] != '\0') {
                          if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                            if (puVar11[iVar5] == '\0') {
                              if (puVar11[iVar5 - lVar2] == '\0') {
                                uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                puVar9[iVar5] = uVar7;
                                img_row_3._4_4_ = iVar5;
                              }
                              else {
                                puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                img_row_3._4_4_ = iVar5;
                              }
                            }
                            else {
                              puVar9[iVar5] = puVar10[iVar5];
                              img_row_3._4_4_ = iVar5;
                            }
                            goto LAB_0032ae39;
                          }
                          if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                            puVar9[iVar5] = puVar9[img_row_3._4_4_];
                            img_row_3._4_4_ = iVar5;
                            goto LAB_0032bf50;
                          }
                          if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                            puVar9[iVar5] = puVar9[img_row_3._4_4_];
                            img_row_3._4_4_ = iVar5;
                            goto LAB_00328d27;
                          }
                          if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                            uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],puVar9[img_row_3._4_4_]);
                            puVar9[iVar5] = uVar7;
                            img_row_3._4_4_ = iVar5;
                          }
                          else if (puVar11[iVar5] == '\0') {
                            if (puVar11[iVar5 - lVar2] == '\0') {
                              uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                              puVar9[iVar5] = uVar7;
                              img_row_3._4_4_ = iVar5;
                            }
                            else {
                              puVar9[iVar5] = puVar10[img_row_3._4_4_];
                              img_row_3._4_4_ = iVar5;
                            }
                          }
                          else {
                            puVar9[iVar5] = puVar10[iVar5];
                            img_row_3._4_4_ = iVar5;
                          }
                          goto LAB_003272c8;
                        }
                        if (puVar12[iVar5] == '\0') {
                          if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                            if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                              puVar9[iVar5] = 0;
                              img_row_3._4_4_ = iVar5;
                              goto LAB_003256b5;
                            }
                            uVar7 = UF::NewLabel();
                            puVar9[iVar5] = uVar7;
                            img_row_3._4_4_ = iVar5;
                            goto LAB_00325e4e;
                          }
                          if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                            if (puVar11[img_row_3._4_4_ + 4] != '\0') {
                              if (puVar11[iVar5] == '\0') {
                                puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                                img_row_3._4_4_ = iVar5;
                              }
                              else if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                                uVar7 = UF::Merge(puVar10[iVar5],puVar10[img_row_3._4_4_ + 4]);
                                puVar9[iVar5] = uVar7;
                                img_row_3._4_4_ = iVar5;
                              }
                              else {
                                puVar9[iVar5] = puVar10[iVar5];
                                img_row_3._4_4_ = iVar5;
                              }
                              goto LAB_003272c8;
                            }
                            if (puVar11[iVar5] == '\0') {
                              uVar7 = UF::NewLabel();
                              puVar9[iVar5] = uVar7;
                              img_row_3._4_4_ = iVar5;
                              goto LAB_00326811;
                            }
                            puVar9[iVar5] = puVar10[iVar5];
                            img_row_3._4_4_ = iVar5;
LAB_00326c4a:
                            iVar5 = img_row_3._4_4_ + 2;
                            if ((int)(uVar1 - 2) <= iVar5) {
                              if ((int)(uVar1 - 2) < iVar5) goto LAB_0032d443;
                              if (puVar8[iVar5] == '\0') {
                                if (puVar12[iVar5] == '\0') {
                                  if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                    if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                                      puVar9[iVar5] = 0;
                                    }
                                    else {
                                      uVar7 = UF::NewLabel();
                                      puVar9[iVar5] = uVar7;
                                    }
                                  }
                                  else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                    uVar7 = UF::NewLabel();
                                    puVar9[iVar5] = uVar7;
                                  }
                                  else {
                                    puVar9[iVar5] = puVar10[iVar5];
                                  }
                                }
                                else if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                  puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                }
                                else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                  puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                }
                                else if (puVar11[iVar5 - lVar2] == '\0') {
                                  uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                  puVar9[iVar5] = uVar7;
                                }
                                else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                  uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                                  puVar9[iVar5] = uVar7;
                                }
                                else {
                                  puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                }
                              }
                              else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                puVar9[iVar5] = puVar9[img_row_3._4_4_];
                              }
                              else if (puVar11[iVar5 - lVar2] == '\0') {
                                uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                puVar9[iVar5] = uVar7;
                              }
                              else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                                puVar9[iVar5] = uVar7;
                              }
                              else {
                                puVar9[iVar5] = puVar10[img_row_3._4_4_];
                              }
                              goto LAB_003316a4;
                            }
                            if (puVar8[iVar5] != '\0') {
                              if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                if (puVar11[iVar5 - lVar2] == '\0') {
                                  uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                  puVar9[iVar5] = uVar7;
                                  img_row_3._4_4_ = iVar5;
                                }
                                else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                  uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                                  puVar9[iVar5] = uVar7;
                                  img_row_3._4_4_ = iVar5;
                                }
                                else {
                                  puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                  img_row_3._4_4_ = iVar5;
                                }
                                goto LAB_0032ae39;
                              }
                              if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                img_row_3._4_4_ = iVar5;
LAB_0032bf50:
                                do {
                                  iVar5 = img_row_3._4_4_ + 2;
                                  if ((int)(uVar1 - 2) <= iVar5) {
                                    if ((int)(uVar1 - 2) < iVar5) {
                                      if (puVar8[iVar5] == '\0') {
                                        if (puVar12[iVar5] == '\0') {
                                          puVar9[iVar5] = 0;
                                        }
                                        else if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                          uVar7 = UF::NewLabel();
                                          puVar9[iVar5] = uVar7;
                                        }
                                        else {
                                          puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                        }
                                      }
                                      else if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                        if (puVar11[iVar5] == '\0') {
                                          uVar7 = UF::NewLabel();
                                          puVar9[iVar5] = uVar7;
                                        }
                                        else {
                                          puVar9[iVar5] = puVar10[iVar5];
                                        }
                                      }
                                      else if (puVar11[iVar5] == '\0') {
                                        puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                      }
                                      else if (puVar11[img_row_3._4_4_] == '\0') {
                                        uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                        puVar9[iVar5] = uVar7;
                                      }
                                      else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                        uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                                        puVar9[iVar5] = uVar7;
                                      }
                                      else {
                                        puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                      }
                                    }
                                    else if (puVar8[iVar5] == '\0') {
                                      if (puVar12[iVar5] == '\0') {
                                        if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                          if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                                            puVar9[iVar5] = 0;
                                          }
                                          else {
                                            uVar7 = UF::NewLabel();
                                            puVar9[iVar5] = uVar7;
                                          }
                                        }
                                        else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                          if (puVar11[iVar5] == '\0') {
                                            uVar7 = UF::NewLabel();
                                            puVar9[iVar5] = uVar7;
                                          }
                                          else {
                                            puVar9[iVar5] = puVar10[iVar5];
                                          }
                                        }
                                        else {
                                          puVar9[iVar5] = puVar10[iVar5];
                                        }
                                      }
                                      else if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                        if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                          uVar7 = UF::NewLabel();
                                          puVar9[iVar5] = uVar7;
                                        }
                                        else {
                                          puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                        }
                                      }
                                      else if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                        if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                          if (puVar11[iVar5] == '\0') {
                                            uVar7 = UF::NewLabel();
                                            puVar9[iVar5] = uVar7;
                                          }
                                          else {
                                            puVar9[iVar5] = puVar10[iVar5];
                                          }
                                        }
                                        else {
                                          puVar9[iVar5] = puVar10[iVar5];
                                        }
                                      }
                                      else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                        if (puVar11[iVar5] == '\0') {
                                          puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                        }
                                        else if (puVar11[img_row_3._4_4_] == '\0') {
                                          uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                          puVar9[iVar5] = uVar7;
                                        }
                                        else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5])
                                          ;
                                          puVar9[iVar5] = uVar7;
                                        }
                                        else {
                                          puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                        }
                                      }
                                      else if (puVar11[img_row_3._4_4_] == '\0') {
                                        uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                        puVar9[iVar5] = uVar7;
                                      }
                                      else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                        uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                                        puVar9[iVar5] = uVar7;
                                      }
                                      else if (puVar11[iVar5] == '\0') {
                                        if (puVar11[iVar5 - lVar2] == '\0') {
                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5])
                                          ;
                                          puVar9[iVar5] = uVar7;
                                        }
                                        else {
                                          puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                        }
                                      }
                                      else {
                                        puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                      }
                                    }
                                    else if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                      if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                        if (puVar11[iVar5] == '\0') {
                                          uVar7 = UF::NewLabel();
                                          puVar9[iVar5] = uVar7;
                                        }
                                        else {
                                          puVar9[iVar5] = puVar10[iVar5];
                                        }
                                      }
                                      else {
                                        puVar9[iVar5] = puVar10[iVar5];
                                      }
                                    }
                                    else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                      if (puVar11[iVar5] == '\0') {
                                        puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                      }
                                      else if (puVar11[img_row_3._4_4_] == '\0') {
                                        uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                        puVar9[iVar5] = uVar7;
                                      }
                                      else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                        uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                                        puVar9[iVar5] = uVar7;
                                      }
                                      else {
                                        puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                      }
                                    }
                                    else if (puVar11[img_row_3._4_4_] == '\0') {
                                      uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                      puVar9[iVar5] = uVar7;
                                    }
                                    else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                      uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                                      puVar9[iVar5] = uVar7;
                                    }
                                    else if (puVar11[iVar5] == '\0') {
                                      if (puVar11[iVar5 - lVar2] == '\0') {
                                        uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                                        puVar9[iVar5] = uVar7;
                                      }
                                      else {
                                        puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                      }
                                    }
                                    else {
                                      puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                    }
                                    goto LAB_003316a4;
                                  }
                                  if (puVar8[iVar5] == '\0') {
                                    if (puVar12[iVar5] == '\0') {
                                      if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                        if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                                          puVar9[iVar5] = 0;
                                          img_row_3._4_4_ = iVar5;
                                          goto LAB_003256b5;
                                        }
                                        uVar7 = UF::NewLabel();
                                        puVar9[iVar5] = uVar7;
                                        img_row_3._4_4_ = iVar5;
                                        goto LAB_00325e4e;
                                      }
                                      if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                        puVar9[iVar5] = puVar10[iVar5];
                                        img_row_3._4_4_ = iVar5;
                                        goto LAB_003276e7;
                                      }
                                      if (puVar11[img_row_3._4_4_ + 4] != '\0') {
                                        if (puVar11[iVar5] == '\0') {
                                          puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                                          img_row_3._4_4_ = iVar5;
                                        }
                                        else if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                                          uVar7 = UF::Merge(puVar10[iVar5],
                                                            puVar10[img_row_3._4_4_ + 4]);
                                          puVar9[iVar5] = uVar7;
                                          img_row_3._4_4_ = iVar5;
                                        }
                                        else {
                                          puVar9[iVar5] = puVar10[iVar5];
                                          img_row_3._4_4_ = iVar5;
                                        }
                                        goto LAB_003272c8;
                                      }
                                      if (puVar11[iVar5] != '\0') {
                                        puVar9[iVar5] = puVar10[iVar5];
                                        img_row_3._4_4_ = iVar5;
                                        goto LAB_00326c4a;
                                      }
                                      uVar7 = UF::NewLabel();
                                      puVar9[iVar5] = uVar7;
                                      img_row_3._4_4_ = iVar5;
                                    }
                                    else {
                                      if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                        if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                          uVar7 = UF::NewLabel();
                                          puVar9[iVar5] = uVar7;
                                          img_row_3._4_4_ = iVar5;
                                          goto LAB_00327dae;
                                        }
                                        puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                        img_row_3._4_4_ = iVar5;
                                        goto LAB_00327dae;
                                      }
                                      if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                        if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                          puVar9[iVar5] = puVar10[iVar5];
                                          img_row_3._4_4_ = iVar5;
                                          goto LAB_003276e7;
                                        }
                                        if (puVar11[img_row_3._4_4_ + 4] != '\0') {
                                          if (puVar11[iVar5] == '\0') {
                                            puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          else if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                                            uVar7 = UF::Merge(puVar10[iVar5],
                                                              puVar10[img_row_3._4_4_ + 4]);
                                            puVar9[iVar5] = uVar7;
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          else {
                                            puVar9[iVar5] = puVar10[iVar5];
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          goto LAB_003272c8;
                                        }
                                        if (puVar11[iVar5] != '\0') {
                                          puVar9[iVar5] = puVar10[iVar5];
                                          img_row_3._4_4_ = iVar5;
                                          goto LAB_00326c4a;
                                        }
                                        uVar7 = UF::NewLabel();
                                        puVar9[iVar5] = uVar7;
                                        img_row_3._4_4_ = iVar5;
                                      }
                                      else {
                                        if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                          if (puVar11[img_row_3._4_4_] == '\0') {
                                            uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]
                                                             );
                                            puVar9[iVar5] = uVar7;
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                            uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                              puVar10[iVar5]);
                                            puVar9[iVar5] = uVar7;
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          else if (puVar11[iVar5] == '\0') {
                                            if (puVar11[iVar5 - lVar2] == '\0') {
                                              uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                puVar10[iVar5]);
                                              puVar9[iVar5] = uVar7;
                                              img_row_3._4_4_ = iVar5;
                                            }
                                            else {
                                              puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                              img_row_3._4_4_ = iVar5;
                                            }
                                          }
                                          else {
                                            puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          goto LAB_003276e7;
                                        }
                                        if (puVar11[img_row_3._4_4_ + 4] != '\0') {
                                          if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                                            if (puVar11[iVar5] == '\0') {
                                              uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],
                                                                puVar9[img_row_3._4_4_]);
                                              puVar9[iVar5] = uVar7;
                                              img_row_3._4_4_ = iVar5;
                                            }
                                            else if (puVar11[img_row_3._4_4_] == '\0') {
                                              uVar7 = UF::Merge(puVar10[iVar5],
                                                                puVar10[img_row_3._4_4_ + 4]);
                                              uVar7 = UF::Merge(uVar7,puVar9[img_row_3._4_4_]);
                                              puVar9[iVar5] = uVar7;
                                              img_row_3._4_4_ = iVar5;
                                            }
                                            else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0')
                                            {
                                              uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                puVar10[iVar5]);
                                              uVar7 = UF::Merge(uVar7,puVar10[img_row_3._4_4_ + 4]);
                                              puVar9[iVar5] = uVar7;
                                              img_row_3._4_4_ = iVar5;
                                            }
                                            else {
                                              uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                puVar10[img_row_3._4_4_ + 4]);
                                              puVar9[iVar5] = uVar7;
                                              img_row_3._4_4_ = iVar5;
                                            }
                                          }
                                          else if (puVar11[img_row_3._4_4_] == '\0') {
                                            uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]
                                                             );
                                            puVar9[iVar5] = uVar7;
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                            uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                              puVar10[iVar5]);
                                            puVar9[iVar5] = uVar7;
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          else if (puVar11[iVar5] == '\0') {
                                            if (puVar11[iVar5 - lVar2] == '\0') {
                                              uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                puVar10[iVar5]);
                                              puVar9[iVar5] = uVar7;
                                              img_row_3._4_4_ = iVar5;
                                            }
                                            else {
                                              puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                              img_row_3._4_4_ = iVar5;
                                            }
                                          }
                                          else {
                                            puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          goto LAB_003272c8;
                                        }
                                        if (puVar11[iVar5] != '\0') {
                                          if (puVar11[img_row_3._4_4_] == '\0') {
                                            uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]
                                                             );
                                            puVar9[iVar5] = uVar7;
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                            uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                              puVar10[iVar5]);
                                            puVar9[iVar5] = uVar7;
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          else {
                                            puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          goto LAB_00326c4a;
                                        }
                                        puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                        img_row_3._4_4_ = iVar5;
                                      }
                                    }
                                  }
                                  else if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                    if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                      puVar9[iVar5] = puVar10[iVar5];
                                      img_row_3._4_4_ = iVar5;
                                      goto LAB_0032ae39;
                                    }
                                    if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                      if (puVar11[iVar5] == '\0') {
                                        uVar7 = UF::NewLabel();
                                        puVar9[iVar5] = uVar7;
                                        img_row_3._4_4_ = iVar5;
                                        goto LAB_00329508;
                                      }
                                      puVar9[iVar5] = puVar10[iVar5];
                                      img_row_3._4_4_ = iVar5;
                                      goto LAB_00329f45;
                                    }
                                    if (puVar11[img_row_3._4_4_ + 4] != '\0') {
                                      if (puVar11[iVar5] == '\0') {
                                        puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                                        img_row_3._4_4_ = iVar5;
                                      }
                                      else if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                                        uVar7 = UF::Merge(puVar10[iVar5],
                                                          puVar10[img_row_3._4_4_ + 4]);
                                        puVar9[iVar5] = uVar7;
                                        img_row_3._4_4_ = iVar5;
                                      }
                                      else {
                                        puVar9[iVar5] = puVar10[iVar5];
                                        img_row_3._4_4_ = iVar5;
                                      }
                                      goto LAB_003272c8;
                                    }
                                    if (puVar11[iVar5] != '\0') {
                                      puVar9[iVar5] = puVar10[iVar5];
                                      img_row_3._4_4_ = iVar5;
                                      goto LAB_00326c4a;
                                    }
                                    uVar7 = UF::NewLabel();
                                    puVar9[iVar5] = uVar7;
                                    img_row_3._4_4_ = iVar5;
                                  }
                                  else {
                                    if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                      if (puVar11[img_row_3._4_4_] == '\0') {
                                        uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                        puVar9[iVar5] = uVar7;
                                        img_row_3._4_4_ = iVar5;
                                      }
                                      else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                        uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                                        puVar9[iVar5] = uVar7;
                                        img_row_3._4_4_ = iVar5;
                                      }
                                      else if (puVar11[iVar5] == '\0') {
                                        if (puVar11[iVar5 - lVar2] == '\0') {
                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5])
                                          ;
                                          puVar9[iVar5] = uVar7;
                                          img_row_3._4_4_ = iVar5;
                                        }
                                        else {
                                          puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                          img_row_3._4_4_ = iVar5;
                                        }
                                      }
                                      else {
                                        puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                        img_row_3._4_4_ = iVar5;
                                      }
                                      goto LAB_0032ae39;
                                    }
                                    if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                      if (puVar11[iVar5] == '\0') {
                                        puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                        img_row_3._4_4_ = iVar5;
                                        goto LAB_00329508;
                                      }
                                      if (puVar11[img_row_3._4_4_] == '\0') {
                                        uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                        puVar9[iVar5] = uVar7;
                                        img_row_3._4_4_ = iVar5;
                                        goto LAB_00329f45;
                                      }
                                      if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                        uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                                        puVar9[iVar5] = uVar7;
                                        img_row_3._4_4_ = iVar5;
                                        goto LAB_00329f45;
                                      }
                                      puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                      img_row_3._4_4_ = iVar5;
                                      goto LAB_00329f45;
                                    }
                                    if (puVar11[img_row_3._4_4_ + 4] != '\0') {
                                      if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                                        if (puVar11[iVar5] == '\0') {
                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],
                                                            puVar9[img_row_3._4_4_]);
                                          puVar9[iVar5] = uVar7;
                                          img_row_3._4_4_ = iVar5;
                                        }
                                        else if (puVar11[img_row_3._4_4_] == '\0') {
                                          uVar7 = UF::Merge(puVar10[iVar5],
                                                            puVar10[img_row_3._4_4_ + 4]);
                                          uVar7 = UF::Merge(uVar7,puVar9[img_row_3._4_4_]);
                                          puVar9[iVar5] = uVar7;
                                          img_row_3._4_4_ = iVar5;
                                        }
                                        else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5])
                                          ;
                                          uVar7 = UF::Merge(uVar7,puVar10[img_row_3._4_4_ + 4]);
                                          puVar9[iVar5] = uVar7;
                                          img_row_3._4_4_ = iVar5;
                                        }
                                        else {
                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                            puVar10[img_row_3._4_4_ + 4]);
                                          puVar9[iVar5] = uVar7;
                                          img_row_3._4_4_ = iVar5;
                                        }
                                      }
                                      else if (puVar11[img_row_3._4_4_] == '\0') {
                                        uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                        puVar9[iVar5] = uVar7;
                                        img_row_3._4_4_ = iVar5;
                                      }
                                      else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                        uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                                        puVar9[iVar5] = uVar7;
                                        img_row_3._4_4_ = iVar5;
                                      }
                                      else if (puVar11[iVar5] == '\0') {
                                        if (puVar11[iVar5 - lVar2] == '\0') {
                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5])
                                          ;
                                          puVar9[iVar5] = uVar7;
                                          img_row_3._4_4_ = iVar5;
                                        }
                                        else {
                                          puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                          img_row_3._4_4_ = iVar5;
                                        }
                                      }
                                      else {
                                        puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                        img_row_3._4_4_ = iVar5;
                                      }
                                      goto LAB_003272c8;
                                    }
                                    if (puVar11[iVar5] != '\0') {
                                      if (puVar11[img_row_3._4_4_] == '\0') {
                                        uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                        puVar9[iVar5] = uVar7;
                                        img_row_3._4_4_ = iVar5;
                                      }
                                      else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                        uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                                        puVar9[iVar5] = uVar7;
                                        img_row_3._4_4_ = iVar5;
                                      }
                                      else {
                                        puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                        img_row_3._4_4_ = iVar5;
                                      }
                                      goto LAB_00326c4a;
                                    }
                                    puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                    img_row_3._4_4_ = iVar5;
                                  }
LAB_00326811:
                                  iVar5 = img_row_3._4_4_ + 2;
                                  if ((int)(uVar1 - 2) <= iVar5) {
                                    if ((int)(uVar1 - 2) < iVar5) goto LAB_0032d443;
                                    if (puVar8[iVar5] == '\0') {
                                      if (puVar12[iVar5] == '\0') {
                                        if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                          if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                                            puVar9[iVar5] = 0;
                                          }
                                          else {
                                            uVar7 = UF::NewLabel();
                                            puVar9[iVar5] = uVar7;
                                          }
                                        }
                                        else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                          uVar7 = UF::NewLabel();
                                          puVar9[iVar5] = uVar7;
                                        }
                                        else {
                                          puVar9[iVar5] = puVar10[iVar5];
                                        }
                                      }
                                      else if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                        puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                      }
                                      else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                        puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                      }
                                      else {
                                        uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                        puVar9[iVar5] = uVar7;
                                      }
                                    }
                                    else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                      puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                    }
                                    else {
                                      uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                      puVar9[iVar5] = uVar7;
                                    }
                                    goto LAB_003316a4;
                                  }
                                  if (puVar8[iVar5] == '\0') {
                                    if (puVar12[iVar5] != '\0') {
                                      if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                        puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                        img_row_3._4_4_ = iVar5;
                                        goto LAB_00327dae;
                                      }
                                      if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                        uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                        puVar9[iVar5] = uVar7;
                                        img_row_3._4_4_ = iVar5;
                                        goto LAB_003276e7;
                                      }
                                      if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                        puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                        img_row_3._4_4_ = iVar5;
                                        goto LAB_00328d27;
                                      }
                                      if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                                        uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],
                                                          puVar9[img_row_3._4_4_]);
                                        puVar9[iVar5] = uVar7;
                                        img_row_3._4_4_ = iVar5;
                                      }
                                      else {
                                        uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                        puVar9[iVar5] = uVar7;
                                        img_row_3._4_4_ = iVar5;
                                      }
                                      goto LAB_003272c8;
                                    }
                                    if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                      if (puVar12[img_row_3._4_4_ + 3] != '\0') {
                                        uVar7 = UF::NewLabel();
                                        puVar9[iVar5] = uVar7;
                                        img_row_3._4_4_ = iVar5;
                                        goto LAB_00325e4e;
                                      }
                                      puVar9[iVar5] = 0;
                                      img_row_3._4_4_ = iVar5;
LAB_003256b5:
                                      do {
                                        iVar5 = img_row_3._4_4_ + 2;
                                        if ((int)(uVar1 - 2) <= iVar5) {
                                          if ((int)(uVar1 - 2) < iVar5) {
                                            if (puVar8[iVar5] == '\0') {
                                              if (puVar12[iVar5] == '\0') {
                                                puVar9[iVar5] = 0;
                                              }
                                              else {
                                                uVar7 = UF::NewLabel();
                                                puVar9[iVar5] = uVar7;
                                              }
                                            }
                                            else if (puVar11[iVar5] == '\0') {
                                              if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                                uVar7 = UF::NewLabel();
                                                puVar9[iVar5] = uVar7;
                                              }
                                              else {
                                                puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                              }
                                            }
                                            else {
                                              puVar9[iVar5] = puVar10[iVar5];
                                            }
                                          }
                                          else if (puVar8[iVar5] == '\0') {
                                            if (puVar12[iVar5] == '\0') {
                                              if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                                if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                                                  puVar9[iVar5] = 0;
                                                }
                                                else {
                                                  uVar7 = UF::NewLabel();
                                                  puVar9[iVar5] = uVar7;
                                                }
                                              }
                                              else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                                if (puVar11[iVar5] == '\0') {
                                                  uVar7 = UF::NewLabel();
                                                  puVar9[iVar5] = uVar7;
                                                }
                                                else {
                                                  puVar9[iVar5] = puVar10[iVar5];
                                                }
                                              }
                                              else {
                                                puVar9[iVar5] = puVar10[iVar5];
                                              }
                                            }
                                            else if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                              uVar7 = UF::NewLabel();
                                              puVar9[iVar5] = uVar7;
                                            }
                                            else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                              if (puVar11[iVar5] == '\0') {
                                                uVar7 = UF::NewLabel();
                                                puVar9[iVar5] = uVar7;
                                              }
                                              else {
                                                puVar9[iVar5] = puVar10[iVar5];
                                              }
                                            }
                                            else {
                                              puVar9[iVar5] = puVar10[iVar5];
                                            }
                                          }
                                          else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                            if (puVar11[iVar5] == '\0') {
                                              if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                                uVar7 = UF::NewLabel();
                                                puVar9[iVar5] = uVar7;
                                              }
                                              else {
                                                puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                              }
                                            }
                                            else {
                                              puVar9[iVar5] = puVar10[iVar5];
                                            }
                                          }
                                          else if (puVar11[iVar5] == '\0') {
                                            if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                              puVar9[iVar5] = puVar10[iVar5];
                                            }
                                            else if (puVar11[iVar5 - lVar2] == '\0') {
                                              uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                puVar10[iVar5]);
                                              puVar9[iVar5] = uVar7;
                                            }
                                            else {
                                              puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                            }
                                          }
                                          else {
                                            puVar9[iVar5] = puVar10[iVar5];
                                          }
                                          goto LAB_003316a4;
                                        }
                                        if (puVar8[iVar5] != '\0') {
                                          if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                            if (puVar11[iVar5] == '\0') {
                                              if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                                puVar9[iVar5] = puVar10[iVar5];
                                                img_row_3._4_4_ = iVar5;
                                              }
                                              else if (puVar11[iVar5 - lVar2] == '\0') {
                                                uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                  puVar10[iVar5]);
                                                puVar9[iVar5] = uVar7;
                                                img_row_3._4_4_ = iVar5;
                                              }
                                              else {
                                                puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                img_row_3._4_4_ = iVar5;
                                              }
                                            }
                                            else {
                                              puVar9[iVar5] = puVar10[iVar5];
                                              img_row_3._4_4_ = iVar5;
                                            }
                                            goto LAB_0032ae39;
                                          }
                                          if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                            if (puVar11[iVar5] != '\0') {
                                              puVar9[iVar5] = puVar10[iVar5];
                                              img_row_3._4_4_ = iVar5;
                                              goto LAB_00329f45;
                                            }
                                            if (puVar11[img_row_3._4_4_ + 1] != '\0') {
                                              puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                              img_row_3._4_4_ = iVar5;
                                              goto LAB_00329508;
                                            }
                                            uVar7 = UF::NewLabel();
                                            puVar9[iVar5] = uVar7;
                                            img_row_3._4_4_ = iVar5;
                                            goto LAB_00329508;
                                          }
                                          if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                            if (puVar11[iVar5] != '\0') {
                                              puVar9[iVar5] = puVar10[iVar5];
                                              img_row_3._4_4_ = iVar5;
                                              goto LAB_00326c4a;
                                            }
                                            if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                              uVar7 = UF::NewLabel();
                                              puVar9[iVar5] = uVar7;
                                              img_row_3._4_4_ = iVar5;
                                            }
                                            else {
                                              puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                              img_row_3._4_4_ = iVar5;
                                            }
                                            goto LAB_00326811;
                                          }
                                          if (puVar11[iVar5] == '\0') {
                                            if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                              puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                                              img_row_3._4_4_ = iVar5;
                                            }
                                            else if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0')
                                            {
                                              uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                puVar10[img_row_3._4_4_ + 4]);
                                              puVar9[iVar5] = uVar7;
                                              img_row_3._4_4_ = iVar5;
                                            }
                                            else if (puVar11[iVar5 - lVar2] == '\0') {
                                              uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                puVar10[iVar5]);
                                              puVar9[iVar5] = uVar7;
                                              img_row_3._4_4_ = iVar5;
                                            }
                                            else {
                                              puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                              img_row_3._4_4_ = iVar5;
                                            }
                                          }
                                          else if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                                            uVar7 = UF::Merge(puVar10[iVar5],
                                                              puVar10[img_row_3._4_4_ + 4]);
                                            puVar9[iVar5] = uVar7;
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          else {
                                            puVar9[iVar5] = puVar10[iVar5];
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          goto LAB_003272c8;
                                        }
                                        if (puVar12[iVar5] != '\0') {
                                          if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                            uVar7 = UF::NewLabel();
                                            puVar9[iVar5] = uVar7;
                                            img_row_3._4_4_ = iVar5;
                                            goto LAB_00327dae;
                                          }
                                          if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                            puVar9[iVar5] = puVar10[iVar5];
                                            img_row_3._4_4_ = iVar5;
                                            goto LAB_003276e7;
                                          }
                                          if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                            if (puVar11[iVar5] == '\0') {
                                              uVar7 = UF::NewLabel();
                                              puVar9[iVar5] = uVar7;
                                              img_row_3._4_4_ = iVar5;
                                              goto LAB_00326811;
                                            }
                                            puVar9[iVar5] = puVar10[iVar5];
                                            img_row_3._4_4_ = iVar5;
                                            goto LAB_00326c4a;
                                          }
                                          if (puVar11[iVar5] == '\0') {
                                            puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          else if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                                            uVar7 = UF::Merge(puVar10[iVar5],
                                                              puVar10[img_row_3._4_4_ + 4]);
                                            puVar9[iVar5] = uVar7;
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          else {
                                            puVar9[iVar5] = puVar10[iVar5];
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          goto LAB_003272c8;
                                        }
                                        if (puVar8[img_row_3._4_4_ + 3] != '\0') {
                                          if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                            puVar9[iVar5] = puVar10[iVar5];
                                            img_row_3._4_4_ = iVar5;
                                            goto LAB_003276e7;
                                          }
                                          if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                            if (puVar11[iVar5] == '\0') {
                                              uVar7 = UF::NewLabel();
                                              puVar9[iVar5] = uVar7;
                                              img_row_3._4_4_ = iVar5;
                                              goto LAB_00326811;
                                            }
                                            puVar9[iVar5] = puVar10[iVar5];
                                            img_row_3._4_4_ = iVar5;
                                            goto LAB_00326c4a;
                                          }
                                          if (puVar11[iVar5] == '\0') {
                                            puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          else if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                                            uVar7 = UF::Merge(puVar10[iVar5],
                                                              puVar10[img_row_3._4_4_ + 4]);
                                            puVar9[iVar5] = uVar7;
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          else {
                                            puVar9[iVar5] = puVar10[iVar5];
                                            img_row_3._4_4_ = iVar5;
                                          }
                                          goto LAB_003272c8;
                                        }
                                        if (puVar12[img_row_3._4_4_ + 3] != '\0') {
                                          uVar7 = UF::NewLabel();
                                          puVar9[iVar5] = uVar7;
                                          img_row_3._4_4_ = iVar5;
LAB_00325e4e:
                                          do {
                                            iVar5 = img_row_3._4_4_ + 2;
                                            if ((int)(uVar1 - 2) <= iVar5) {
                                              if ((int)(uVar1 - 2) < iVar5) {
                                                if (puVar8[iVar5] == '\0') {
                                                  if (puVar12[iVar5] == '\0') {
                                                    puVar9[iVar5] = 0;
                                                  }
                                                  else {
                                                    puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                  }
                                                }
                                                else if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                                  if (puVar11[iVar5] == '\0') {
                                                    puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                  }
                                                  else {
                                                    uVar7 = UF::Merge(puVar10[iVar5],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                  }
                                                }
                                                else {
                                                  uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                    puVar9[img_row_3._4_4_]);
                                                  puVar9[iVar5] = uVar7;
                                                }
                                              }
                                              else if (puVar8[iVar5] == '\0') {
                                                if (puVar12[iVar5] == '\0') {
                                                  if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                                    if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                                                      puVar9[iVar5] = 0;
                                                    }
                                                    else {
                                                      uVar7 = UF::NewLabel();
                                                      puVar9[iVar5] = uVar7;
                                                    }
                                                  }
                                                  else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                                    if (puVar11[iVar5] == '\0') {
                                                      uVar7 = UF::NewLabel();
                                                      puVar9[iVar5] = uVar7;
                                                    }
                                                    else {
                                                      puVar9[iVar5] = puVar10[iVar5];
                                                    }
                                                  }
                                                  else {
                                                    puVar9[iVar5] = puVar10[iVar5];
                                                  }
                                                }
                                                else if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                                  puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                }
                                                else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                                  if (puVar11[iVar5] == '\0') {
                                                    puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                  }
                                                  else {
                                                    uVar7 = UF::Merge(puVar10[iVar5],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                  }
                                                }
                                                else {
                                                  uVar7 = UF::Merge(puVar10[iVar5],
                                                                    puVar9[img_row_3._4_4_]);
                                                  puVar9[iVar5] = uVar7;
                                                }
                                              }
                                              else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                                if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                                  if (puVar11[iVar5] == '\0') {
                                                    puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                  }
                                                  else {
                                                    uVar7 = UF::Merge(puVar10[iVar5],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                  }
                                                }
                                                else {
                                                  uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                    puVar9[img_row_3._4_4_]);
                                                  puVar9[iVar5] = uVar7;
                                                }
                                              }
                                              else if (puVar11[iVar5] == '\0') {
                                                if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                                  uVar7 = UF::Merge(puVar10[iVar5],
                                                                    puVar9[img_row_3._4_4_]);
                                                  puVar9[iVar5] = uVar7;
                                                }
                                                else if (puVar11[iVar5 - lVar2] == '\0') {
                                                  uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                    puVar10[iVar5]);
                                                  uVar7 = UF::Merge(uVar7,puVar9[img_row_3._4_4_]);
                                                  puVar9[iVar5] = uVar7;
                                                }
                                                else {
                                                  uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                    puVar9[img_row_3._4_4_]);
                                                  puVar9[iVar5] = uVar7;
                                                }
                                              }
                                              else {
                                                uVar7 = UF::Merge(puVar10[iVar5],
                                                                  puVar9[img_row_3._4_4_]);
                                                puVar9[iVar5] = uVar7;
                                              }
                                              goto LAB_003316a4;
                                            }
                                            if (puVar8[iVar5] != '\0') {
                                              if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                if (puVar11[iVar5] == '\0') {
                                                  if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                                    uVar7 = UF::Merge(puVar10[iVar5],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  else if (puVar11[iVar5 - lVar2] == '\0') {
                                                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                      puVar10[iVar5]);
                                                    uVar7 = UF::Merge(uVar7,puVar9[img_row_3._4_4_])
                                                    ;
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  else {
                                                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                }
                                                else {
                                                  uVar7 = UF::Merge(puVar10[iVar5],
                                                                    puVar9[img_row_3._4_4_]);
                                                  puVar9[iVar5] = uVar7;
                                                  img_row_3._4_4_ = iVar5;
                                                }
                                                goto LAB_0032ae39;
                                              }
                                              if (puVar8[img_row_3._4_4_ + 3] != '\0') {
                                                if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                                  if (puVar11[img_row_3._4_4_ + 1] != '\0') {
                                                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                    goto LAB_00328d27;
                                                  }
                                                  if (puVar11[iVar5] == '\0') {
                                                    puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                    img_row_3._4_4_ = iVar5;
                                                    goto LAB_00326811;
                                                  }
                                                  uVar7 = UF::Merge(puVar10[iVar5],
                                                                    puVar9[img_row_3._4_4_]);
                                                  puVar9[iVar5] = uVar7;
                                                  img_row_3._4_4_ = iVar5;
                                                  goto LAB_00326c4a;
                                                }
                                                if (puVar11[iVar5] == '\0') {
                                                  if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  else if (puVar11[(img_row_3._4_4_ + 3) - lVar2] ==
                                                           '\0') {
                                                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                      puVar10[img_row_3._4_4_ + 4]);
                                                    uVar7 = UF::Merge(uVar7,puVar9[img_row_3._4_4_])
                                                    ;
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  else if (puVar11[iVar5 - lVar2] == '\0') {
                                                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                      puVar10[iVar5]);
                                                    uVar7 = UF::Merge(uVar7,puVar9[img_row_3._4_4_])
                                                    ;
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  else {
                                                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                }
                                                else if (puVar11[(img_row_3._4_4_ + 3) - lVar2] ==
                                                         '\0') {
                                                  uVar7 = UF::Merge(puVar10[iVar5],
                                                                    puVar10[img_row_3._4_4_ + 4]);
                                                  uVar7 = UF::Merge(uVar7,puVar9[img_row_3._4_4_]);
                                                  puVar9[iVar5] = uVar7;
                                                  img_row_3._4_4_ = iVar5;
                                                }
                                                else {
                                                  uVar7 = UF::Merge(puVar10[iVar5],
                                                                    puVar9[img_row_3._4_4_]);
                                                  puVar9[iVar5] = uVar7;
                                                  img_row_3._4_4_ = iVar5;
                                                }
                                                goto LAB_003272c8;
                                              }
                                              if (puVar11[img_row_3._4_4_ + 1] != '\0') {
                                                uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                  puVar9[img_row_3._4_4_]);
                                                puVar9[iVar5] = uVar7;
                                                img_row_3._4_4_ = iVar5;
                                                goto LAB_0032bf50;
                                              }
                                              if (puVar11[iVar5] != '\0') {
                                                uVar7 = UF::Merge(puVar10[iVar5],
                                                                  puVar9[img_row_3._4_4_]);
                                                puVar9[iVar5] = uVar7;
                                                img_row_3._4_4_ = iVar5;
                                                goto LAB_00329f45;
                                              }
                                              puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                              img_row_3._4_4_ = iVar5;
LAB_00329508:
                                              iVar5 = img_row_3._4_4_ + 2;
                                              if ((int)(uVar1 - 2) <= iVar5) {
                                                if ((int)(uVar1 - 2) < iVar5) {
                                                  if (puVar8[iVar5] == '\0') {
                                                    if (puVar12[iVar5] == '\0') {
                                                      puVar9[iVar5] = 0;
                                                    }
                                                    else if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                                      uVar7 = UF::NewLabel();
                                                      puVar9[iVar5] = uVar7;
                                                    }
                                                    else {
                                                      puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                    }
                                                  }
                                                  else if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                                    if (puVar11[iVar5] == '\0') {
                                                      uVar7 = UF::NewLabel();
                                                      puVar9[iVar5] = uVar7;
                                                    }
                                                    else {
                                                      puVar9[iVar5] = puVar10[iVar5];
                                                    }
                                                  }
                                                  else if (puVar11[iVar5] == '\0') {
                                                    puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                  }
                                                  else {
                                                    uVar7 = UF::Merge(puVar10[iVar5],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                  }
                                                }
                                                else if (puVar8[iVar5] == '\0') {
                                                  if (puVar12[iVar5] == '\0') {
                                                    if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                                      if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                                                        puVar9[iVar5] = 0;
                                                      }
                                                      else {
                                                        uVar7 = UF::NewLabel();
                                                        puVar9[iVar5] = uVar7;
                                                      }
                                                    }
                                                    else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                                      if (puVar11[iVar5] == '\0') {
                                                        uVar7 = UF::NewLabel();
                                                        puVar9[iVar5] = uVar7;
                                                      }
                                                      else {
                                                        puVar9[iVar5] = puVar10[iVar5];
                                                      }
                                                    }
                                                    else {
                                                      puVar9[iVar5] = puVar10[iVar5];
                                                    }
                                                  }
                                                  else if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                                    if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                                      uVar7 = UF::NewLabel();
                                                      puVar9[iVar5] = uVar7;
                                                    }
                                                    else {
                                                      puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                    }
                                                  }
                                                  else if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                                    if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                                      if (puVar11[iVar5] == '\0') {
                                                        uVar7 = UF::NewLabel();
                                                        puVar9[iVar5] = uVar7;
                                                      }
                                                      else {
                                                        puVar9[iVar5] = puVar10[iVar5];
                                                      }
                                                    }
                                                    else {
                                                      puVar9[iVar5] = puVar10[iVar5];
                                                    }
                                                  }
                                                  else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                                    if (puVar11[iVar5] == '\0') {
                                                      puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                    }
                                                    else {
                                                      uVar7 = UF::Merge(puVar10[iVar5],
                                                                        puVar9[img_row_3._4_4_]);
                                                      puVar9[iVar5] = uVar7;
                                                    }
                                                  }
                                                  else {
                                                    uVar7 = UF::Merge(puVar10[iVar5],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                  }
                                                }
                                                else if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                                  if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                                    if (puVar11[iVar5] == '\0') {
                                                      uVar7 = UF::NewLabel();
                                                      puVar9[iVar5] = uVar7;
                                                    }
                                                    else {
                                                      puVar9[iVar5] = puVar10[iVar5];
                                                    }
                                                  }
                                                  else {
                                                    puVar9[iVar5] = puVar10[iVar5];
                                                  }
                                                }
                                                else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                                  if (puVar11[iVar5] == '\0') {
                                                    puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                  }
                                                  else {
                                                    uVar7 = UF::Merge(puVar10[iVar5],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                  }
                                                }
                                                else {
                                                  uVar7 = UF::Merge(puVar10[iVar5],
                                                                    puVar9[img_row_3._4_4_]);
                                                  puVar9[iVar5] = uVar7;
                                                }
                                                goto LAB_003316a4;
                                              }
                                              if (puVar8[iVar5] != '\0') {
                                                if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                                  if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                    puVar9[iVar5] = puVar10[iVar5];
                                                    img_row_3._4_4_ = iVar5;
                                                    goto LAB_0032ae39;
                                                  }
                                                  if (puVar8[img_row_3._4_4_ + 3] != '\0') {
                                                    if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                                      if (puVar11[iVar5] == '\0') {
                                                        uVar7 = UF::NewLabel();
                                                        puVar9[iVar5] = uVar7;
                                                        img_row_3._4_4_ = iVar5;
                                                        goto LAB_00326811;
                                                      }
                                                      puVar9[iVar5] = puVar10[iVar5];
                                                      img_row_3._4_4_ = iVar5;
                                                      goto LAB_00326c4a;
                                                    }
                                                    if (puVar11[iVar5] == '\0') {
                                                      puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                                                      img_row_3._4_4_ = iVar5;
                                                    }
                                                    else if (puVar11[(img_row_3._4_4_ + 3) - lVar2]
                                                             == '\0') {
                                                      uVar7 = UF::Merge(puVar10[iVar5],
                                                                        puVar10[img_row_3._4_4_ + 4]
                                                                       );
                                                      puVar9[iVar5] = uVar7;
                                                      img_row_3._4_4_ = iVar5;
                                                    }
                                                    else {
                                                      puVar9[iVar5] = puVar10[iVar5];
                                                      img_row_3._4_4_ = iVar5;
                                                    }
                                                    goto LAB_003272c8;
                                                  }
                                                  if (puVar11[iVar5] != '\0') {
                                                    puVar9[iVar5] = puVar10[iVar5];
                                                    img_row_3._4_4_ = iVar5;
                                                    goto LAB_00329f45;
                                                  }
                                                  uVar7 = UF::NewLabel();
                                                  puVar9[iVar5] = uVar7;
                                                  img_row_3._4_4_ = iVar5;
                                                }
                                                else {
                                                  if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                    uVar7 = UF::Merge(puVar10[iVar5],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                    goto LAB_0032ae39;
                                                  }
                                                  if (puVar8[img_row_3._4_4_ + 3] != '\0') {
                                                    if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                                      if (puVar11[iVar5] == '\0') {
                                                        puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                        img_row_3._4_4_ = iVar5;
                                                        goto LAB_00326811;
                                                      }
                                                      uVar7 = UF::Merge(puVar10[iVar5],
                                                                        puVar9[img_row_3._4_4_]);
                                                      puVar9[iVar5] = uVar7;
                                                      img_row_3._4_4_ = iVar5;
                                                      goto LAB_00326c4a;
                                                    }
                                                    if (puVar11[(img_row_3._4_4_ + 3) - lVar2] ==
                                                        '\0') {
                                                      if (puVar11[iVar5] == '\0') {
                                                        uVar7 = UF::Merge(puVar10[img_row_3._4_4_ +
                                                                                  4],
                                                                          puVar9[img_row_3._4_4_]);
                                                        puVar9[iVar5] = uVar7;
                                                        img_row_3._4_4_ = iVar5;
                                                      }
                                                      else {
                                                        uVar7 = UF::Merge(puVar10[iVar5],
                                                                          puVar10[img_row_3._4_4_ +
                                                                                  4]);
                                                        uVar7 = UF::Merge(uVar7,puVar9[img_row_3.
                                                                                       _4_4_]);
                                                        puVar9[iVar5] = uVar7;
                                                        img_row_3._4_4_ = iVar5;
                                                      }
                                                    }
                                                    else {
                                                      uVar7 = UF::Merge(puVar10[iVar5],
                                                                        puVar9[img_row_3._4_4_]);
                                                      puVar9[iVar5] = uVar7;
                                                      img_row_3._4_4_ = iVar5;
                                                    }
                                                    goto LAB_003272c8;
                                                  }
                                                  if (puVar11[iVar5] != '\0') {
                                                    uVar7 = UF::Merge(puVar10[iVar5],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                    goto LAB_00329f45;
                                                  }
                                                  puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                  img_row_3._4_4_ = iVar5;
                                                }
                                                goto LAB_00329508;
                                              }
                                              if (puVar12[iVar5] != '\0') {
                                                if (puVar8[img_row_3._4_4_ + 3] != '\0') {
                                                  if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                                    if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                      puVar9[iVar5] = puVar10[iVar5];
                                                      img_row_3._4_4_ = iVar5;
                                                      goto LAB_003276e7;
                                                    }
                                                    if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                                      if (puVar11[iVar5] == '\0') {
                                                        uVar7 = UF::NewLabel();
                                                        puVar9[iVar5] = uVar7;
                                                        img_row_3._4_4_ = iVar5;
                                                        goto LAB_00326811;
                                                      }
                                                      puVar9[iVar5] = puVar10[iVar5];
                                                      img_row_3._4_4_ = iVar5;
                                                      goto LAB_00326c4a;
                                                    }
                                                    if (puVar11[iVar5] == '\0') {
                                                      puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                                                      img_row_3._4_4_ = iVar5;
                                                    }
                                                    else if (puVar11[(img_row_3._4_4_ + 3) - lVar2]
                                                             == '\0') {
                                                      uVar7 = UF::Merge(puVar10[iVar5],
                                                                        puVar10[img_row_3._4_4_ + 4]
                                                                       );
                                                      puVar9[iVar5] = uVar7;
                                                      img_row_3._4_4_ = iVar5;
                                                    }
                                                    else {
                                                      puVar9[iVar5] = puVar10[iVar5];
                                                      img_row_3._4_4_ = iVar5;
                                                    }
                                                    goto LAB_003272c8;
                                                  }
                                                  if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                    uVar7 = UF::Merge(puVar10[iVar5],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                    goto LAB_003276e7;
                                                  }
                                                  if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                                    if (puVar11[iVar5] == '\0') {
                                                      puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                      img_row_3._4_4_ = iVar5;
                                                      goto LAB_00326811;
                                                    }
                                                    uVar7 = UF::Merge(puVar10[iVar5],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                    goto LAB_00326c4a;
                                                  }
                                                  if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0'
                                                     ) {
                                                    if (puVar11[iVar5] == '\0') {
                                                      uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4]
                                                                        ,puVar9[img_row_3._4_4_]);
                                                      puVar9[iVar5] = uVar7;
                                                      img_row_3._4_4_ = iVar5;
                                                    }
                                                    else {
                                                      uVar7 = UF::Merge(puVar10[iVar5],
                                                                        puVar10[img_row_3._4_4_ + 4]
                                                                       );
                                                      uVar7 = UF::Merge(uVar7,puVar9[img_row_3._4_4_
                                                                                    ]);
                                                      puVar9[iVar5] = uVar7;
                                                      img_row_3._4_4_ = iVar5;
                                                    }
                                                  }
                                                  else {
                                                    uVar7 = UF::Merge(puVar10[iVar5],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  goto LAB_003272c8;
                                                }
                                                if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                                  uVar7 = UF::NewLabel();
                                                  puVar9[iVar5] = uVar7;
                                                  img_row_3._4_4_ = iVar5;
                                                }
                                                else {
                                                  puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                  img_row_3._4_4_ = iVar5;
                                                }
LAB_00327dae:
                                                while( true ) {
                                                  while( true ) {
                                                    iVar5 = img_row_3._4_4_ + 2;
                                                    if ((int)(uVar1 - 2) <= iVar5) {
                                                      if ((int)(uVar1 - 2) < iVar5) {
                                                        if (puVar8[iVar5] == '\0') {
                                                          if (puVar12[iVar5] == '\0') {
                                                            puVar9[iVar5] = 0;
                                                          }
                                                          else if (puVar12[img_row_3._4_4_ + 1] ==
                                                                   '\0') {
                                                            uVar7 = UF::NewLabel();
                                                            puVar9[iVar5] = uVar7;
                                                          }
                                                          else {
                                                            puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                          }
                                                        }
                                                        else if (puVar12[img_row_3._4_4_ + 1] ==
                                                                 '\0') {
                                                          if (puVar11[iVar5] == '\0') {
                                                            if (puVar11[img_row_3._4_4_ + 1] == '\0'
                                                               ) {
                                                              uVar7 = UF::NewLabel();
                                                              puVar9[iVar5] = uVar7;
                                                            }
                                                            else {
                                                              puVar9[iVar5] =
                                                                   puVar10[img_row_3._4_4_];
                                                            }
                                                          }
                                                          else {
                                                            puVar9[iVar5] = puVar10[iVar5];
                                                          }
                                                        }
                                                        else if (puVar11[img_row_3._4_4_ + 1] ==
                                                                 '\0') {
                                                          if (puVar11[iVar5] == '\0') {
                                                            puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                          }
                                                          else {
                                                            uVar7 = UF::Merge(puVar10[iVar5],
                                                                              puVar9[img_row_3._4_4_
                                                                                    ]);
                                                            puVar9[iVar5] = uVar7;
                                                          }
                                                        }
                                                        else {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar9[img_row_3._4_4_]
                                                                           );
                                                          puVar9[iVar5] = uVar7;
                                                        }
                                                      }
                                                      else if (puVar8[iVar5] == '\0') {
                                                        if (puVar12[iVar5] == '\0') {
                                                          if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                                            if (puVar12[img_row_3._4_4_ + 3] == '\0'
                                                               ) {
                                                              puVar9[iVar5] = 0;
                                                            }
                                                            else {
                                                              uVar7 = UF::NewLabel();
                                                              puVar9[iVar5] = uVar7;
                                                            }
                                                          }
                                                          else if (puVar11[img_row_3._4_4_ + 3] ==
                                                                   '\0') {
                                                            if (puVar11[iVar5] == '\0') {
                                                              uVar7 = UF::NewLabel();
                                                              puVar9[iVar5] = uVar7;
                                                            }
                                                            else {
                                                              puVar9[iVar5] = puVar10[iVar5];
                                                            }
                                                          }
                                                          else {
                                                            puVar9[iVar5] = puVar10[iVar5];
                                                          }
                                                        }
                                                        else if (puVar8[img_row_3._4_4_ + 3] == '\0'
                                                                ) {
                                                          if (puVar12[img_row_3._4_4_ + 1] == '\0')
                                                          {
                                                            uVar7 = UF::NewLabel();
                                                            puVar9[iVar5] = uVar7;
                                                          }
                                                          else {
                                                            puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                          }
                                                        }
                                                        else if (puVar12[img_row_3._4_4_ + 1] ==
                                                                 '\0') {
                                                          if (puVar11[img_row_3._4_4_ + 3] == '\0')
                                                          {
                                                            if (puVar11[iVar5] == '\0') {
                                                              uVar7 = UF::NewLabel();
                                                              puVar9[iVar5] = uVar7;
                                                            }
                                                            else {
                                                              puVar9[iVar5] = puVar10[iVar5];
                                                            }
                                                          }
                                                          else {
                                                            puVar9[iVar5] = puVar10[iVar5];
                                                          }
                                                        }
                                                        else if (puVar11[img_row_3._4_4_ + 3] ==
                                                                 '\0') {
                                                          if (puVar11[iVar5] == '\0') {
                                                            puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                          }
                                                          else {
                                                            uVar7 = UF::Merge(puVar10[iVar5],
                                                                              puVar9[img_row_3._4_4_
                                                                                    ]);
                                                            puVar9[iVar5] = uVar7;
                                                          }
                                                        }
                                                        else {
                                                          uVar7 = UF::Merge(puVar10[iVar5],
                                                                            puVar9[img_row_3._4_4_])
                                                          ;
                                                          puVar9[iVar5] = uVar7;
                                                        }
                                                      }
                                                      else if (puVar12[img_row_3._4_4_ + 1] == '\0')
                                                      {
                                                        if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                                          if (puVar11[iVar5] == '\0') {
                                                            if (puVar11[img_row_3._4_4_ + 1] == '\0'
                                                               ) {
                                                              uVar7 = UF::NewLabel();
                                                              puVar9[iVar5] = uVar7;
                                                            }
                                                            else {
                                                              puVar9[iVar5] =
                                                                   puVar10[img_row_3._4_4_];
                                                            }
                                                          }
                                                          else {
                                                            puVar9[iVar5] = puVar10[iVar5];
                                                          }
                                                        }
                                                        else if (puVar11[iVar5] == '\0') {
                                                          if (puVar11[img_row_3._4_4_ + 1] == '\0')
                                                          {
                                                            puVar9[iVar5] = puVar10[iVar5];
                                                          }
                                                          else if (puVar11[iVar5 - lVar2] == '\0') {
                                                            uVar7 = UF::Merge(puVar10[img_row_3.
                                                                                      _4_4_],
                                                                              puVar10[iVar5]);
                                                            puVar9[iVar5] = uVar7;
                                                          }
                                                          else {
                                                            puVar9[iVar5] = puVar10[img_row_3._4_4_]
                                                            ;
                                                          }
                                                        }
                                                        else {
                                                          puVar9[iVar5] = puVar10[iVar5];
                                                        }
                                                      }
                                                      else if (puVar11[img_row_3._4_4_ + 3] == '\0')
                                                      {
                                                        if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                                          if (puVar11[iVar5] == '\0') {
                                                            puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                          }
                                                          else {
                                                            uVar7 = UF::Merge(puVar10[iVar5],
                                                                              puVar9[img_row_3._4_4_
                                                                                    ]);
                                                            puVar9[iVar5] = uVar7;
                                                          }
                                                        }
                                                        else {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar9[img_row_3._4_4_]
                                                                           );
                                                          puVar9[iVar5] = uVar7;
                                                        }
                                                      }
                                                      else if (puVar11[iVar5] == '\0') {
                                                        if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                                          uVar7 = UF::Merge(puVar10[iVar5],
                                                                            puVar9[img_row_3._4_4_])
                                                          ;
                                                          puVar9[iVar5] = uVar7;
                                                        }
                                                        else if (puVar11[iVar5 - lVar2] == '\0') {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar10[iVar5]);
                                                          uVar7 = UF::Merge(uVar7,puVar9[img_row_3.
                                                                                         _4_4_]);
                                                          puVar9[iVar5] = uVar7;
                                                        }
                                                        else {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar9[img_row_3._4_4_]
                                                                           );
                                                          puVar9[iVar5] = uVar7;
                                                        }
                                                      }
                                                      else {
                                                        uVar7 = UF::Merge(puVar10[iVar5],
                                                                          puVar9[img_row_3._4_4_]);
                                                        puVar9[iVar5] = uVar7;
                                                      }
                                                      goto LAB_003316a4;
                                                    }
                                                    if (puVar8[iVar5] != '\0') break;
                                                    if (puVar12[iVar5] == '\0') {
                                                      if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                                        if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                                                          puVar9[iVar5] = 0;
                                                          img_row_3._4_4_ = iVar5;
                                                          goto LAB_003256b5;
                                                        }
                                                        uVar7 = UF::NewLabel();
                                                        puVar9[iVar5] = uVar7;
                                                        img_row_3._4_4_ = iVar5;
                                                        goto LAB_00325e4e;
                                                      }
                                                      if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                        puVar9[iVar5] = puVar10[iVar5];
                                                        img_row_3._4_4_ = iVar5;
                                                        goto LAB_003276e7;
                                                      }
                                                      if (puVar11[img_row_3._4_4_ + 4] != '\0') {
                                                        if (puVar11[iVar5] == '\0') {
                                                          puVar9[iVar5] =
                                                               puVar10[img_row_3._4_4_ + 4];
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else if (puVar11[(img_row_3._4_4_ + 3) -
                                                                         lVar2] == '\0') {
                                                          uVar7 = UF::Merge(puVar10[iVar5],
                                                                            puVar10[img_row_3._4_4_
                                                                                    + 4]);
                                                          puVar9[iVar5] = uVar7;
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else {
                                                          puVar9[iVar5] = puVar10[iVar5];
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        goto LAB_003272c8;
                                                      }
                                                      if (puVar11[iVar5] != '\0') {
                                                        puVar9[iVar5] = puVar10[iVar5];
                                                        img_row_3._4_4_ = iVar5;
                                                        goto LAB_00326c4a;
                                                      }
                                                      uVar7 = UF::NewLabel();
                                                      puVar9[iVar5] = uVar7;
                                                      img_row_3._4_4_ = iVar5;
                                                      goto LAB_00326811;
                                                    }
                                                    if (puVar8[img_row_3._4_4_ + 3] != '\0') {
                                                      if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                                        if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                          puVar9[iVar5] = puVar10[iVar5];
                                                          img_row_3._4_4_ = iVar5;
                                                          goto LAB_003276e7;
                                                        }
                                                        if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                                          if (puVar11[iVar5] == '\0') {
                                                            uVar7 = UF::NewLabel();
                                                            puVar9[iVar5] = uVar7;
                                                            img_row_3._4_4_ = iVar5;
                                                            goto LAB_00326811;
                                                          }
                                                          puVar9[iVar5] = puVar10[iVar5];
                                                          img_row_3._4_4_ = iVar5;
                                                          goto LAB_00326c4a;
                                                        }
                                                        if (puVar11[iVar5] == '\0') {
                                                          puVar9[iVar5] =
                                                               puVar10[img_row_3._4_4_ + 4];
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else if (puVar11[(img_row_3._4_4_ + 3) -
                                                                         lVar2] == '\0') {
                                                          uVar7 = UF::Merge(puVar10[iVar5],
                                                                            puVar10[img_row_3._4_4_
                                                                                    + 4]);
                                                          puVar9[iVar5] = uVar7;
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else {
                                                          puVar9[iVar5] = puVar10[iVar5];
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        goto LAB_003272c8;
                                                      }
                                                      if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                        uVar7 = UF::Merge(puVar10[iVar5],
                                                                          puVar9[img_row_3._4_4_]);
                                                        puVar9[iVar5] = uVar7;
                                                        img_row_3._4_4_ = iVar5;
                                                        goto LAB_003276e7;
                                                      }
                                                      if (puVar11[img_row_3._4_4_ + 4] != '\0') {
                                                        if (puVar11[(img_row_3._4_4_ + 3) - lVar2]
                                                            == '\0') {
                                                          if (puVar11[iVar5] == '\0') {
                                                            uVar7 = UF::Merge(puVar10[img_row_3.
                                                                                      _4_4_ + 4],
                                                                              puVar9[img_row_3._4_4_
                                                                                    ]);
                                                            puVar9[iVar5] = uVar7;
                                                            img_row_3._4_4_ = iVar5;
                                                          }
                                                          else {
                                                            uVar7 = UF::Merge(puVar10[iVar5],
                                                                              puVar10[img_row_3.
                                                                                      _4_4_ + 4]);
                                                            uVar7 = UF::Merge(uVar7,puVar9[img_row_3
                                                  ._4_4_]);
                                                  puVar9[iVar5] = uVar7;
                                                  img_row_3._4_4_ = iVar5;
                                                  }
                                                  }
                                                  else {
                                                    uVar7 = UF::Merge(puVar10[iVar5],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  goto LAB_003272c8;
                                                  }
                                                  if (puVar11[iVar5] != '\0') {
                                                    uVar7 = UF::Merge(puVar10[iVar5],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                    goto LAB_00326c4a;
                                                  }
                                                  puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                  img_row_3._4_4_ = iVar5;
                                                  goto LAB_00326811;
                                                  }
                                                  if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                                    uVar7 = UF::NewLabel();
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  else {
                                                    puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  }
                                                  if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                                    if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                      if (puVar11[iVar5] == '\0') {
                                                        if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                                          puVar9[iVar5] = puVar10[iVar5];
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else if (puVar11[iVar5 - lVar2] == '\0') {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar10[iVar5]);
                                                          puVar9[iVar5] = uVar7;
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else {
                                                          puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                      }
                                                      else {
                                                        puVar9[iVar5] = puVar10[iVar5];
                                                        img_row_3._4_4_ = iVar5;
                                                      }
                                                      goto LAB_0032ae39;
                                                    }
                                                    if (puVar8[img_row_3._4_4_ + 3] != '\0') {
                                                      if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                                        if (puVar11[iVar5] != '\0') {
                                                          puVar9[iVar5] = puVar10[iVar5];
                                                          img_row_3._4_4_ = iVar5;
                                                          goto LAB_00326c4a;
                                                        }
                                                        if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                                          uVar7 = UF::NewLabel();
                                                          puVar9[iVar5] = uVar7;
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else {
                                                          puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        goto LAB_00326811;
                                                      }
                                                      if (puVar11[iVar5] == '\0') {
                                                        if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                                          puVar9[iVar5] =
                                                               puVar10[img_row_3._4_4_ + 4];
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else if (puVar11[(img_row_3._4_4_ + 3) -
                                                                         lVar2] == '\0') {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar10[img_row_3._4_4_
                                                                                     + 4]);
                                                          puVar9[iVar5] = uVar7;
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else if (puVar11[iVar5 - lVar2] == '\0') {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar10[iVar5]);
                                                          puVar9[iVar5] = uVar7;
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else {
                                                          puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                      }
                                                      else if (puVar11[(img_row_3._4_4_ + 3) - lVar2
                                                                      ] == '\0') {
                                                        uVar7 = UF::Merge(puVar10[iVar5],
                                                                          puVar10[img_row_3._4_4_ +
                                                                                  4]);
                                                        puVar9[iVar5] = uVar7;
                                                        img_row_3._4_4_ = iVar5;
                                                      }
                                                      else {
                                                        puVar9[iVar5] = puVar10[iVar5];
                                                        img_row_3._4_4_ = iVar5;
                                                      }
                                                      goto LAB_003272c8;
                                                    }
                                                    if (puVar11[iVar5] == '\0') {
                                                      if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                                        uVar7 = UF::NewLabel();
                                                        puVar9[iVar5] = uVar7;
                                                        img_row_3._4_4_ = iVar5;
                                                      }
                                                      else {
                                                        puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                        img_row_3._4_4_ = iVar5;
                                                      }
                                                      goto LAB_00329508;
                                                    }
                                                    puVar9[iVar5] = puVar10[iVar5];
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  else {
                                                    if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                      if (puVar11[iVar5] == '\0') {
                                                        if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                                          uVar7 = UF::Merge(puVar10[iVar5],
                                                                            puVar9[img_row_3._4_4_])
                                                          ;
                                                          puVar9[iVar5] = uVar7;
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else if (puVar11[iVar5 - lVar2] == '\0') {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar10[iVar5]);
                                                          uVar7 = UF::Merge(uVar7,puVar9[img_row_3.
                                                                                         _4_4_]);
                                                          puVar9[iVar5] = uVar7;
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar9[img_row_3._4_4_]
                                                                           );
                                                          puVar9[iVar5] = uVar7;
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                      }
                                                      else {
                                                        uVar7 = UF::Merge(puVar10[iVar5],
                                                                          puVar9[img_row_3._4_4_]);
                                                        puVar9[iVar5] = uVar7;
                                                        img_row_3._4_4_ = iVar5;
                                                      }
                                                      goto LAB_0032ae39;
                                                    }
                                                    if (puVar8[img_row_3._4_4_ + 3] != '\0') {
                                                      if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                                        if (puVar11[img_row_3._4_4_ + 1] != '\0') {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar9[img_row_3._4_4_]
                                                                           );
                                                          puVar9[iVar5] = uVar7;
                                                          img_row_3._4_4_ = iVar5;
                                                          goto LAB_00328d27;
                                                        }
                                                        if (puVar11[iVar5] == '\0') {
                                                          puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                          img_row_3._4_4_ = iVar5;
                                                          goto LAB_00326811;
                                                        }
                                                        uVar7 = UF::Merge(puVar10[iVar5],
                                                                          puVar9[img_row_3._4_4_]);
                                                        puVar9[iVar5] = uVar7;
                                                        img_row_3._4_4_ = iVar5;
                                                        goto LAB_00326c4a;
                                                      }
                                                      if (puVar11[iVar5] == '\0') {
                                                        if (puVar11[img_row_3._4_4_ + 1] == '\0') {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_
                                                                                    + 4],
                                                                            puVar9[img_row_3._4_4_])
                                                          ;
                                                          puVar9[iVar5] = uVar7;
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else if (puVar11[(img_row_3._4_4_ + 3) -
                                                                         lVar2] == '\0') {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar10[img_row_3._4_4_
                                                                                     + 4]);
                                                          uVar7 = UF::Merge(uVar7,puVar9[img_row_3.
                                                                                         _4_4_]);
                                                          puVar9[iVar5] = uVar7;
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else if (puVar11[iVar5 - lVar2] == '\0') {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar10[iVar5]);
                                                          uVar7 = UF::Merge(uVar7,puVar9[img_row_3.
                                                                                         _4_4_]);
                                                          puVar9[iVar5] = uVar7;
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar9[img_row_3._4_4_]
                                                                           );
                                                          puVar9[iVar5] = uVar7;
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                      }
                                                      else if (puVar11[(img_row_3._4_4_ + 3) - lVar2
                                                                      ] == '\0') {
                                                        uVar7 = UF::Merge(puVar10[iVar5],
                                                                          puVar10[img_row_3._4_4_ +
                                                                                  4]);
                                                        uVar7 = UF::Merge(uVar7,puVar9[img_row_3.
                                                                                       _4_4_]);
                                                        puVar9[iVar5] = uVar7;
                                                        img_row_3._4_4_ = iVar5;
                                                      }
                                                      else {
                                                        uVar7 = UF::Merge(puVar10[iVar5],
                                                                          puVar9[img_row_3._4_4_]);
                                                        puVar9[iVar5] = uVar7;
                                                        img_row_3._4_4_ = iVar5;
                                                      }
                                                      goto LAB_003272c8;
                                                    }
                                                    if (puVar11[img_row_3._4_4_ + 1] != '\0') {
                                                      uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                        puVar9[img_row_3._4_4_]);
                                                      puVar9[iVar5] = uVar7;
                                                      img_row_3._4_4_ = iVar5;
                                                      goto LAB_0032bf50;
                                                    }
                                                    if (puVar11[iVar5] == '\0') {
                                                      puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                      img_row_3._4_4_ = iVar5;
                                                      goto LAB_00329508;
                                                    }
                                                    uVar7 = UF::Merge(puVar10[iVar5],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
LAB_00329f45:
                                                  while( true ) {
                                                    iVar5 = img_row_3._4_4_ + 2;
                                                    if ((int)(uVar1 - 2) <= iVar5) {
                                                      if ((int)(uVar1 - 2) < iVar5) {
                                                        if (puVar8[iVar5] == '\0') {
                                                          if (puVar12[iVar5] == '\0') {
                                                            puVar9[iVar5] = 0;
                                                          }
                                                          else if (puVar12[img_row_3._4_4_ + 1] ==
                                                                   '\0') {
                                                            uVar7 = UF::NewLabel();
                                                            puVar9[iVar5] = uVar7;
                                                          }
                                                          else {
                                                            puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                          }
                                                        }
                                                        else if (puVar12[img_row_3._4_4_ + 1] ==
                                                                 '\0') {
                                                          if (puVar11[iVar5] == '\0') {
                                                            uVar7 = UF::NewLabel();
                                                            puVar9[iVar5] = uVar7;
                                                          }
                                                          else {
                                                            puVar9[iVar5] = puVar10[iVar5];
                                                          }
                                                        }
                                                        else if (puVar11[iVar5] == '\0') {
                                                          puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                        }
                                                        else if (puVar11[(img_row_3._4_4_ + 1) -
                                                                         lVar2] == '\0') {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar10[iVar5]);
                                                          puVar9[iVar5] = uVar7;
                                                        }
                                                        else {
                                                          puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                        }
                                                      }
                                                      else if (puVar8[iVar5] == '\0') {
                                                        if (puVar12[iVar5] == '\0') {
                                                          if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                                            if (puVar12[img_row_3._4_4_ + 3] == '\0'
                                                               ) {
                                                              puVar9[iVar5] = 0;
                                                            }
                                                            else {
                                                              uVar7 = UF::NewLabel();
                                                              puVar9[iVar5] = uVar7;
                                                            }
                                                          }
                                                          else if (puVar11[img_row_3._4_4_ + 3] ==
                                                                   '\0') {
                                                            if (puVar11[iVar5] == '\0') {
                                                              uVar7 = UF::NewLabel();
                                                              puVar9[iVar5] = uVar7;
                                                            }
                                                            else {
                                                              puVar9[iVar5] = puVar10[iVar5];
                                                            }
                                                          }
                                                          else {
                                                            puVar9[iVar5] = puVar10[iVar5];
                                                          }
                                                        }
                                                        else if (puVar8[img_row_3._4_4_ + 3] == '\0'
                                                                ) {
                                                          if (puVar12[img_row_3._4_4_ + 1] == '\0')
                                                          {
                                                            uVar7 = UF::NewLabel();
                                                            puVar9[iVar5] = uVar7;
                                                          }
                                                          else {
                                                            puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                          }
                                                        }
                                                        else if (puVar12[img_row_3._4_4_ + 1] ==
                                                                 '\0') {
                                                          if (puVar11[img_row_3._4_4_ + 3] == '\0')
                                                          {
                                                            if (puVar11[iVar5] == '\0') {
                                                              uVar7 = UF::NewLabel();
                                                              puVar9[iVar5] = uVar7;
                                                            }
                                                            else {
                                                              puVar9[iVar5] = puVar10[iVar5];
                                                            }
                                                          }
                                                          else {
                                                            puVar9[iVar5] = puVar10[iVar5];
                                                          }
                                                        }
                                                        else if (puVar11[img_row_3._4_4_ + 3] ==
                                                                 '\0') {
                                                          if (puVar11[iVar5] == '\0') {
                                                            puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                          }
                                                          else if (puVar11[(img_row_3._4_4_ + 1) -
                                                                           lVar2] == '\0') {
                                                            uVar7 = UF::Merge(puVar10[img_row_3.
                                                                                      _4_4_],
                                                                              puVar10[iVar5]);
                                                            puVar9[iVar5] = uVar7;
                                                          }
                                                          else {
                                                            puVar9[iVar5] = puVar10[img_row_3._4_4_]
                                                            ;
                                                          }
                                                        }
                                                        else if (puVar11[(img_row_3._4_4_ + 1) -
                                                                         lVar2] == '\0') {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar10[iVar5]);
                                                          puVar9[iVar5] = uVar7;
                                                        }
                                                        else if (puVar11[iVar5] == '\0') {
                                                          if (puVar11[iVar5 - lVar2] == '\0') {
                                                            uVar7 = UF::Merge(puVar10[img_row_3.
                                                                                      _4_4_],
                                                                              puVar10[iVar5]);
                                                            puVar9[iVar5] = uVar7;
                                                          }
                                                          else {
                                                            puVar9[iVar5] = puVar10[img_row_3._4_4_]
                                                            ;
                                                          }
                                                        }
                                                        else {
                                                          puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                        }
                                                      }
                                                      else if (puVar12[img_row_3._4_4_ + 1] == '\0')
                                                      {
                                                        if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                                          if (puVar11[iVar5] == '\0') {
                                                            uVar7 = UF::NewLabel();
                                                            puVar9[iVar5] = uVar7;
                                                          }
                                                          else {
                                                            puVar9[iVar5] = puVar10[iVar5];
                                                          }
                                                        }
                                                        else {
                                                          puVar9[iVar5] = puVar10[iVar5];
                                                        }
                                                      }
                                                      else if (puVar11[img_row_3._4_4_ + 3] == '\0')
                                                      {
                                                        if (puVar11[iVar5] == '\0') {
                                                          puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                        }
                                                        else if (puVar11[(img_row_3._4_4_ + 1) -
                                                                         lVar2] == '\0') {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar10[iVar5]);
                                                          puVar9[iVar5] = uVar7;
                                                        }
                                                        else {
                                                          puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                        }
                                                      }
                                                      else if (puVar11[(img_row_3._4_4_ + 1) - lVar2
                                                                      ] == '\0') {
                                                        uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                          puVar10[iVar5]);
                                                        puVar9[iVar5] = uVar7;
                                                      }
                                                      else if (puVar11[iVar5] == '\0') {
                                                        if (puVar11[iVar5 - lVar2] == '\0') {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar10[iVar5]);
                                                          puVar9[iVar5] = uVar7;
                                                        }
                                                        else {
                                                          puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                        }
                                                      }
                                                      else {
                                                        puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                      }
                                                      goto LAB_003316a4;
                                                    }
                                                    if (puVar8[iVar5] == '\0') break;
                                                    if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                                      if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                        puVar9[iVar5] = puVar10[iVar5];
                                                        img_row_3._4_4_ = iVar5;
                                                        goto LAB_0032ae39;
                                                      }
                                                      if (puVar8[img_row_3._4_4_ + 3] != '\0') {
                                                        if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                                          if (puVar11[iVar5] == '\0') {
                                                            uVar7 = UF::NewLabel();
                                                            puVar9[iVar5] = uVar7;
                                                            img_row_3._4_4_ = iVar5;
                                                            goto LAB_00326811;
                                                          }
                                                          puVar9[iVar5] = puVar10[iVar5];
                                                          img_row_3._4_4_ = iVar5;
                                                          goto LAB_00326c4a;
                                                        }
                                                        if (puVar11[iVar5] == '\0') {
                                                          puVar9[iVar5] =
                                                               puVar10[img_row_3._4_4_ + 4];
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else if (puVar11[(img_row_3._4_4_ + 3) -
                                                                         lVar2] == '\0') {
                                                          uVar7 = UF::Merge(puVar10[iVar5],
                                                                            puVar10[img_row_3._4_4_
                                                                                    + 4]);
                                                          puVar9[iVar5] = uVar7;
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else {
                                                          puVar9[iVar5] = puVar10[iVar5];
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        goto LAB_003272c8;
                                                      }
                                                      if (puVar11[iVar5] == '\0') {
                                                        uVar7 = UF::NewLabel();
                                                        puVar9[iVar5] = uVar7;
                                                        img_row_3._4_4_ = iVar5;
                                                        goto LAB_00329508;
                                                      }
                                                      puVar9[iVar5] = puVar10[iVar5];
                                                      img_row_3._4_4_ = iVar5;
                                                    }
                                                    else {
                                                      if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                        if (puVar11[(img_row_3._4_4_ + 1) - lVar2]
                                                            == '\0') {
                                                          uVar7 = UF::Merge(puVar10[img_row_3._4_4_]
                                                                            ,puVar10[iVar5]);
                                                          puVar9[iVar5] = uVar7;
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        else if (puVar11[iVar5] == '\0') {
                                                          if (puVar11[iVar5 - lVar2] == '\0') {
                                                            uVar7 = UF::Merge(puVar10[img_row_3.
                                                                                      _4_4_],
                                                                              puVar10[iVar5]);
                                                            puVar9[iVar5] = uVar7;
                                                            img_row_3._4_4_ = iVar5;
                                                          }
                                                          else {
                                                            puVar9[iVar5] = puVar10[img_row_3._4_4_]
                                                            ;
                                                            img_row_3._4_4_ = iVar5;
                                                          }
                                                        }
                                                        else {
                                                          puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                          img_row_3._4_4_ = iVar5;
                                                        }
                                                        goto LAB_0032ae39;
                                                      }
                                                      if (puVar8[img_row_3._4_4_ + 3] != '\0') {
                                                        if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                                          if (puVar11[iVar5] == '\0') {
                                                            puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                            img_row_3._4_4_ = iVar5;
                                                            goto LAB_00326811;
                                                          }
                                                          if (puVar11[(img_row_3._4_4_ + 1) - lVar2]
                                                              == '\0') {
                                                            uVar7 = UF::Merge(puVar10[img_row_3.
                                                                                      _4_4_],
                                                                              puVar10[iVar5]);
                                                            puVar9[iVar5] = uVar7;
                                                            img_row_3._4_4_ = iVar5;
                                                          }
                                                          else {
                                                            puVar9[iVar5] = puVar10[img_row_3._4_4_]
                                                            ;
                                                            img_row_3._4_4_ = iVar5;
                                                          }
                                                          goto LAB_00326c4a;
                                                        }
                                                        if (puVar11[(img_row_3._4_4_ + 3) - lVar2]
                                                            == '\0') {
                                                          if (puVar11[iVar5] == '\0') {
                                                            uVar7 = UF::Merge(puVar10[img_row_3.
                                                                                      _4_4_ + 4],
                                                                              puVar9[img_row_3._4_4_
                                                                                    ]);
                                                            puVar9[iVar5] = uVar7;
                                                            img_row_3._4_4_ = iVar5;
                                                          }
                                                          else if (puVar11[(img_row_3._4_4_ + 1) -
                                                                           lVar2] == '\0') {
                                                            uVar7 = UF::Merge(puVar10[img_row_3.
                                                                                      _4_4_],
                                                                              puVar10[iVar5]);
                                                            uVar7 = UF::Merge(uVar7,puVar10[
                                                  img_row_3._4_4_ + 4]);
                                                  puVar9[iVar5] = uVar7;
                                                  img_row_3._4_4_ = iVar5;
                                                  }
                                                  else {
                                                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                      puVar10[img_row_3._4_4_ + 4]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  }
                                                  else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] ==
                                                           '\0') {
                                                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                      puVar10[iVar5]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  else if (puVar11[iVar5] == '\0') {
                                                    if (puVar11[iVar5 - lVar2] == '\0') {
                                                      uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                        puVar10[iVar5]);
                                                      puVar9[iVar5] = uVar7;
                                                      img_row_3._4_4_ = iVar5;
                                                    }
                                                    else {
                                                      puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                      img_row_3._4_4_ = iVar5;
                                                    }
                                                  }
                                                  else {
                                                    puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  goto LAB_003272c8;
                                                  }
                                                  if (puVar11[iVar5] == '\0') {
                                                    puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                    img_row_3._4_4_ = iVar5;
                                                    goto LAB_00329508;
                                                  }
                                                  if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0'
                                                     ) {
                                                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                      puVar10[iVar5]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  else {
                                                    puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  }
                                                  }
                                                  if (puVar12[iVar5] == '\0') {
                                                    if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                                      if (puVar12[img_row_3._4_4_ + 3] != '\0') {
                                                        uVar7 = UF::NewLabel();
                                                        puVar9[iVar5] = uVar7;
                                                        img_row_3._4_4_ = iVar5;
                                                        goto LAB_00325e4e;
                                                      }
                                                      puVar9[iVar5] = 0;
                                                      img_row_3._4_4_ = iVar5;
                                                      goto LAB_003256b5;
                                                    }
                                                    if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                      puVar9[iVar5] = puVar10[iVar5];
                                                      img_row_3._4_4_ = iVar5;
                                                      goto LAB_003276e7;
                                                    }
                                                    if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                                      if (puVar11[iVar5] == '\0') {
                                                        uVar7 = UF::NewLabel();
                                                        puVar9[iVar5] = uVar7;
                                                        img_row_3._4_4_ = iVar5;
                                                        goto LAB_00326811;
                                                      }
                                                      puVar9[iVar5] = puVar10[iVar5];
                                                      img_row_3._4_4_ = iVar5;
                                                      goto LAB_00326c4a;
                                                    }
                                                    if (puVar11[iVar5] == '\0') {
                                                      puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                                                      img_row_3._4_4_ = iVar5;
                                                    }
                                                    else if (puVar11[(img_row_3._4_4_ + 3) - lVar2]
                                                             == '\0') {
                                                      uVar7 = UF::Merge(puVar10[iVar5],
                                                                        puVar10[img_row_3._4_4_ + 4]
                                                                       );
                                                      puVar9[iVar5] = uVar7;
                                                      img_row_3._4_4_ = iVar5;
                                                    }
                                                    else {
                                                      puVar9[iVar5] = puVar10[iVar5];
                                                      img_row_3._4_4_ = iVar5;
                                                    }
                                                    goto LAB_003272c8;
                                                  }
                                                  if (puVar8[img_row_3._4_4_ + 3] != '\0') break;
                                                  if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                                    uVar7 = UF::NewLabel();
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  else {
                                                    puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                }
                                                if (puVar12[img_row_3._4_4_ + 1] == '\0') {
                                                  if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                    puVar9[iVar5] = puVar10[iVar5];
                                                    img_row_3._4_4_ = iVar5;
                                                    goto LAB_003276e7;
                                                  }
                                                  if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                                    if (puVar11[iVar5] == '\0') {
                                                      uVar7 = UF::NewLabel();
                                                      puVar9[iVar5] = uVar7;
                                                      img_row_3._4_4_ = iVar5;
                                                      goto LAB_00326811;
                                                    }
                                                    puVar9[iVar5] = puVar10[iVar5];
                                                    img_row_3._4_4_ = iVar5;
                                                    goto LAB_00326c4a;
                                                  }
                                                  if (puVar11[iVar5] == '\0') {
                                                    puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  else if (puVar11[(img_row_3._4_4_ + 3) - lVar2] ==
                                                           '\0') {
                                                    uVar7 = UF::Merge(puVar10[iVar5],
                                                                      puVar10[img_row_3._4_4_ + 4]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  else {
                                                    puVar9[iVar5] = puVar10[iVar5];
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  goto LAB_003272c8;
                                                }
                                                if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                  if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0'
                                                     ) {
                                                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                      puVar10[iVar5]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  else if (puVar11[iVar5] == '\0') {
                                                    if (puVar11[iVar5 - lVar2] == '\0') {
                                                      uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                        puVar10[iVar5]);
                                                      puVar9[iVar5] = uVar7;
                                                      img_row_3._4_4_ = iVar5;
                                                    }
                                                    else {
                                                      puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                      img_row_3._4_4_ = iVar5;
                                                    }
                                                  }
                                                  else {
                                                    puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  goto LAB_003276e7;
                                                }
                                                if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                                  if (puVar11[iVar5] == '\0') {
                                                    puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                    img_row_3._4_4_ = iVar5;
                                                    goto LAB_00326811;
                                                  }
                                                  if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0'
                                                     ) {
                                                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                      puVar10[iVar5]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  else {
                                                    puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  goto LAB_00326c4a;
                                                }
                                                if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0')
                                                {
                                                  if (puVar11[iVar5] == '\0') {
                                                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],
                                                                      puVar9[img_row_3._4_4_]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] ==
                                                           '\0') {
                                                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                      puVar10[iVar5]);
                                                    uVar7 = UF::Merge(uVar7,puVar10[img_row_3._4_4_
                                                                                    + 4]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  else {
                                                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                      puVar10[img_row_3._4_4_ + 4]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                }
                                                else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] ==
                                                         '\0') {
                                                  uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                    puVar10[iVar5]);
                                                  puVar9[iVar5] = uVar7;
                                                  img_row_3._4_4_ = iVar5;
                                                }
                                                else if (puVar11[iVar5] == '\0') {
                                                  if (puVar11[iVar5 - lVar2] == '\0') {
                                                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],
                                                                      puVar10[iVar5]);
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                  else {
                                                    puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                    img_row_3._4_4_ = iVar5;
                                                  }
                                                }
                                                else {
                                                  puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                                  img_row_3._4_4_ = iVar5;
                                                }
                                                goto LAB_003272c8;
                                              }
                                              if (puVar8[img_row_3._4_4_ + 3] != '\0') {
                                                if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                  puVar9[iVar5] = puVar10[iVar5];
                                                  img_row_3._4_4_ = iVar5;
                                                  goto LAB_003276e7;
                                                }
                                                if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                                  if (puVar11[iVar5] == '\0') {
                                                    uVar7 = UF::NewLabel();
                                                    puVar9[iVar5] = uVar7;
                                                    img_row_3._4_4_ = iVar5;
                                                    goto LAB_00326811;
                                                  }
                                                  puVar9[iVar5] = puVar10[iVar5];
                                                  img_row_3._4_4_ = iVar5;
                                                  goto LAB_00326c4a;
                                                }
                                                if (puVar11[iVar5] == '\0') {
                                                  puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                                                  img_row_3._4_4_ = iVar5;
                                                }
                                                else if (puVar11[(img_row_3._4_4_ + 3) - lVar2] ==
                                                         '\0') {
                                                  uVar7 = UF::Merge(puVar10[iVar5],
                                                                    puVar10[img_row_3._4_4_ + 4]);
                                                  puVar9[iVar5] = uVar7;
                                                  img_row_3._4_4_ = iVar5;
                                                }
                                                else {
                                                  puVar9[iVar5] = puVar10[iVar5];
                                                  img_row_3._4_4_ = iVar5;
                                                }
                                                goto LAB_003272c8;
                                              }
                                              if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                                                puVar9[iVar5] = 0;
                                                img_row_3._4_4_ = iVar5;
                                                goto LAB_003256b5;
                                              }
                                              uVar7 = UF::NewLabel();
                                              puVar9[iVar5] = uVar7;
                                              img_row_3._4_4_ = iVar5;
                                              goto LAB_00325e4e;
                                            }
                                            if (puVar12[iVar5] != '\0') {
                                              if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                                puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                img_row_3._4_4_ = iVar5;
                                                goto LAB_00327dae;
                                              }
                                              if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                uVar7 = UF::Merge(puVar10[iVar5],
                                                                  puVar9[img_row_3._4_4_]);
                                                puVar9[iVar5] = uVar7;
                                                img_row_3._4_4_ = iVar5;
                                                goto LAB_003276e7;
                                              }
                                              if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                                if (puVar11[iVar5] == '\0') {
                                                  puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                                  img_row_3._4_4_ = iVar5;
                                                  goto LAB_00326811;
                                                }
                                                uVar7 = UF::Merge(puVar10[iVar5],
                                                                  puVar9[img_row_3._4_4_]);
                                                puVar9[iVar5] = uVar7;
                                                img_row_3._4_4_ = iVar5;
                                                goto LAB_00326c4a;
                                              }
                                              if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                                                if (puVar11[iVar5] == '\0') {
                                                  uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],
                                                                    puVar9[img_row_3._4_4_]);
                                                  puVar9[iVar5] = uVar7;
                                                  img_row_3._4_4_ = iVar5;
                                                }
                                                else {
                                                  uVar7 = UF::Merge(puVar10[iVar5],
                                                                    puVar10[img_row_3._4_4_ + 4]);
                                                  uVar7 = UF::Merge(uVar7,puVar9[img_row_3._4_4_]);
                                                  puVar9[iVar5] = uVar7;
                                                  img_row_3._4_4_ = iVar5;
                                                }
                                              }
                                              else {
                                                uVar7 = UF::Merge(puVar10[iVar5],
                                                                  puVar9[img_row_3._4_4_]);
                                                puVar9[iVar5] = uVar7;
                                                img_row_3._4_4_ = iVar5;
                                              }
                                              goto LAB_003272c8;
                                            }
                                            if (puVar8[img_row_3._4_4_ + 3] != '\0') {
                                              if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                                puVar9[iVar5] = puVar10[iVar5];
                                                img_row_3._4_4_ = iVar5;
                                                goto LAB_003276e7;
                                              }
                                              if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                                if (puVar11[iVar5] == '\0') {
                                                  uVar7 = UF::NewLabel();
                                                  puVar9[iVar5] = uVar7;
                                                  img_row_3._4_4_ = iVar5;
                                                  goto LAB_00326811;
                                                }
                                                puVar9[iVar5] = puVar10[iVar5];
                                                img_row_3._4_4_ = iVar5;
                                                goto LAB_00326c4a;
                                              }
                                              if (puVar11[iVar5] == '\0') {
                                                puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                                                img_row_3._4_4_ = iVar5;
                                              }
                                              else if (puVar11[(img_row_3._4_4_ + 3) - lVar2] ==
                                                       '\0') {
                                                uVar7 = UF::Merge(puVar10[iVar5],
                                                                  puVar10[img_row_3._4_4_ + 4]);
                                                puVar9[iVar5] = uVar7;
                                                img_row_3._4_4_ = iVar5;
                                              }
                                              else {
                                                puVar9[iVar5] = puVar10[iVar5];
                                                img_row_3._4_4_ = iVar5;
                                              }
                                              goto LAB_003272c8;
                                            }
                                            if (puVar12[img_row_3._4_4_ + 3] == '\0')
                                            goto LAB_003267fa;
                                            uVar7 = UF::NewLabel();
                                            puVar9[iVar5] = uVar7;
                                            img_row_3._4_4_ = iVar5;
                                          } while( true );
                                        }
                                        puVar9[iVar5] = 0;
                                        img_row_3._4_4_ = iVar5;
                                      } while( true );
                                    }
                                    if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                      puVar9[iVar5] = puVar10[iVar5];
                                      img_row_3._4_4_ = iVar5;
                                      goto LAB_003276e7;
                                    }
                                    if (puVar11[img_row_3._4_4_ + 4] != '\0') {
                                      puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                                      img_row_3._4_4_ = iVar5;
                                      goto LAB_003272c8;
                                    }
                                    uVar7 = UF::NewLabel();
                                    puVar9[iVar5] = uVar7;
                                    img_row_3._4_4_ = iVar5;
                                    goto LAB_00326811;
                                  }
                                  if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                                    uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                    puVar9[iVar5] = uVar7;
                                    img_row_3._4_4_ = iVar5;
                                    goto LAB_0032ae39;
                                  }
                                  if (puVar8[img_row_3._4_4_ + 3] != '\0') {
                                    if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                      puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                      img_row_3._4_4_ = iVar5;
                                      goto LAB_00328d27;
                                    }
                                    if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                                      uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],
                                                        puVar9[img_row_3._4_4_]);
                                      puVar9[iVar5] = uVar7;
                                      img_row_3._4_4_ = iVar5;
                                    }
                                    else {
                                      uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                      puVar9[iVar5] = uVar7;
                                      img_row_3._4_4_ = iVar5;
                                    }
                                    goto LAB_003272c8;
                                  }
                                  puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                  img_row_3._4_4_ = iVar5;
                                } while( true );
                              }
                              if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                img_row_3._4_4_ = iVar5;
                                goto LAB_00328d27;
                              }
                              if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                                uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],
                                                  puVar9[img_row_3._4_4_]);
                                puVar9[iVar5] = uVar7;
                                img_row_3._4_4_ = iVar5;
                              }
                              else if (puVar11[iVar5 - lVar2] == '\0') {
                                uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                puVar9[iVar5] = uVar7;
                                img_row_3._4_4_ = iVar5;
                              }
                              else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                                puVar9[iVar5] = uVar7;
                                img_row_3._4_4_ = iVar5;
                              }
                              else {
                                puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                img_row_3._4_4_ = iVar5;
                              }
                              goto LAB_003272c8;
                            }
                            if (puVar12[iVar5] == '\0') {
                              if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                                  puVar9[iVar5] = 0;
                                  img_row_3._4_4_ = iVar5;
                                  goto LAB_003256b5;
                                }
                                uVar7 = UF::NewLabel();
                                puVar9[iVar5] = uVar7;
                                img_row_3._4_4_ = iVar5;
                                goto LAB_00325e4e;
                              }
                              if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                  uVar7 = UF::NewLabel();
                                  puVar9[iVar5] = uVar7;
                                  img_row_3._4_4_ = iVar5;
                                  goto LAB_00326811;
                                }
                                puVar9[iVar5] = puVar10[img_row_3._4_4_ + 4];
                                img_row_3._4_4_ = iVar5;
                                goto LAB_003272c8;
                              }
                              puVar9[iVar5] = puVar10[iVar5];
                              img_row_3._4_4_ = iVar5;
                            }
                            else {
                              if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                                puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                img_row_3._4_4_ = iVar5;
                                goto LAB_00327dae;
                              }
                              if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                                if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                                  puVar9[iVar5] = puVar9[img_row_3._4_4_];
                                  img_row_3._4_4_ = iVar5;
                                  goto LAB_00328d27;
                                }
                                if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                                  uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],
                                                    puVar9[img_row_3._4_4_]);
                                  puVar9[iVar5] = uVar7;
                                  img_row_3._4_4_ = iVar5;
                                }
                                else if (puVar11[iVar5 - lVar2] == '\0') {
                                  uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                  puVar9[iVar5] = uVar7;
                                  img_row_3._4_4_ = iVar5;
                                }
                                else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                  uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                                  puVar9[iVar5] = uVar7;
                                  img_row_3._4_4_ = iVar5;
                                }
                                else {
                                  puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                  img_row_3._4_4_ = iVar5;
                                }
                                goto LAB_003272c8;
                              }
                              if (puVar11[iVar5 - lVar2] == '\0') {
                                uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                puVar9[iVar5] = uVar7;
                                img_row_3._4_4_ = iVar5;
                              }
                              else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                                uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                                puVar9[iVar5] = uVar7;
                                img_row_3._4_4_ = iVar5;
                              }
                              else {
                                puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                img_row_3._4_4_ = iVar5;
                              }
                            }
                          }
                          else {
                            puVar9[iVar5] = puVar10[iVar5];
                            img_row_3._4_4_ = iVar5;
                          }
                        }
                        else {
                          if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                            puVar9[iVar5] = puVar9[img_row_3._4_4_];
                            img_row_3._4_4_ = iVar5;
                            goto LAB_00327dae;
                          }
                          if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                            if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                              puVar9[iVar5] = puVar9[img_row_3._4_4_];
                              img_row_3._4_4_ = iVar5;
                              goto LAB_00328d27;
                            }
                            if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                              uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],puVar9[img_row_3._4_4_]
                                               );
                              puVar9[iVar5] = uVar7;
                              img_row_3._4_4_ = iVar5;
                            }
                            else if (puVar11[iVar5] == '\0') {
                              if (puVar11[iVar5 - lVar2] == '\0') {
                                uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                                puVar9[iVar5] = uVar7;
                                img_row_3._4_4_ = iVar5;
                              }
                              else {
                                puVar9[iVar5] = puVar10[img_row_3._4_4_];
                                img_row_3._4_4_ = iVar5;
                              }
                            }
                            else {
                              puVar9[iVar5] = puVar10[iVar5];
                              img_row_3._4_4_ = iVar5;
                            }
                            goto LAB_003272c8;
                          }
                          if (puVar11[iVar5] == '\0') {
                            if (puVar11[iVar5 - lVar2] == '\0') {
                              uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                              puVar9[iVar5] = uVar7;
                              img_row_3._4_4_ = iVar5;
                            }
                            else {
                              puVar9[iVar5] = puVar10[img_row_3._4_4_];
                              img_row_3._4_4_ = iVar5;
                            }
                          }
                          else {
                            puVar9[iVar5] = puVar10[iVar5];
                            img_row_3._4_4_ = iVar5;
                          }
                        }
                      } while( true );
                    }
                    if (puVar11[img_row_3._4_4_ + 3] != '\0') {
                      if (puVar11[iVar5 - lVar2] == '\0') {
                        uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                        puVar9[iVar5] = uVar7;
                        img_row_3._4_4_ = iVar5;
                      }
                      else if (puVar11[img_row_3._4_4_] == '\0') {
                        uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                        puVar9[iVar5] = uVar7;
                        img_row_3._4_4_ = iVar5;
                      }
                      else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
                        uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                        puVar9[iVar5] = uVar7;
                        img_row_3._4_4_ = iVar5;
                      }
                      else {
                        puVar9[iVar5] = puVar10[img_row_3._4_4_];
                        img_row_3._4_4_ = iVar5;
                      }
                      goto LAB_0032ae39;
                    }
                    if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                      puVar9[iVar5] = puVar9[img_row_3._4_4_];
                      img_row_3._4_4_ = iVar5;
                      goto LAB_0032bf50;
                    }
                    if (puVar11[img_row_3._4_4_ + 4] != '\0') goto code_r0x00328eea;
                    puVar9[iVar5] = puVar9[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                  } while( true );
                }
                if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                  uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],puVar9[img_row_3._4_4_]);
                  puVar9[iVar5] = uVar7;
                  img_row_3._4_4_ = iVar5;
                }
                else {
                  puVar9[iVar5] = puVar10[iVar5];
                  img_row_3._4_4_ = iVar5;
                }
              }
            } while( true );
          }
          if (puVar8[img_row_3._4_4_ + 1] == '\0') {
            if (puVar12[img_row_3._4_4_ + 1] == '\0') {
              if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                  if (puVar11[iVar5] == '\0') {
                    puVar9[iVar5] = puVar10[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_00329508;
                  }
                  puVar9[iVar5] = puVar10[iVar5];
                  img_row_3._4_4_ = iVar5;
                  goto LAB_00329f45;
                }
                if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                  if (puVar11[iVar5] == '\0') {
                    puVar9[iVar5] = puVar10[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_00326811;
                  }
                  puVar9[iVar5] = puVar10[iVar5];
                  img_row_3._4_4_ = iVar5;
                  goto LAB_00326c4a;
                }
                if (puVar11[iVar5] == '\0') {
                  if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[img_row_3._4_4_ + 4]);
                    puVar9[iVar5] = uVar7;
                    img_row_3._4_4_ = iVar5;
                  }
                  else if (puVar11[iVar5 - lVar2] == '\0') {
                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                    puVar9[iVar5] = uVar7;
                    img_row_3._4_4_ = iVar5;
                  }
                  else {
                    puVar9[iVar5] = puVar10[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                  }
                }
                else if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                  uVar7 = UF::Merge(puVar10[iVar5],puVar10[img_row_3._4_4_ + 4]);
                  puVar9[iVar5] = uVar7;
                  img_row_3._4_4_ = iVar5;
                }
                else {
                  puVar9[iVar5] = puVar10[iVar5];
                  img_row_3._4_4_ = iVar5;
                }
                goto LAB_003272c8;
              }
              if (puVar11[iVar5] == '\0') {
                if (puVar11[iVar5 - lVar2] == '\0') {
                  uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                  puVar9[iVar5] = uVar7;
                  img_row_3._4_4_ = iVar5;
                }
                else {
                  puVar9[iVar5] = puVar10[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
                }
              }
              else {
                puVar9[iVar5] = puVar10[iVar5];
                img_row_3._4_4_ = iVar5;
              }
            }
            else {
              if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                  puVar9[iVar5] = puVar10[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
                  goto LAB_0032bf50;
                }
                if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                  puVar9[iVar5] = puVar10[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
                  goto LAB_00328d27;
                }
                if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                  uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[img_row_3._4_4_ + 4]);
                  puVar9[iVar5] = uVar7;
                  img_row_3._4_4_ = iVar5;
                }
                else if (puVar11[iVar5] == '\0') {
                  if (puVar11[iVar5 - lVar2] == '\0') {
                    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                    puVar9[iVar5] = uVar7;
                    img_row_3._4_4_ = iVar5;
                  }
                  else {
                    puVar9[iVar5] = puVar10[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                  }
                }
                else {
                  puVar9[iVar5] = puVar10[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
                }
                goto LAB_003272c8;
              }
              if (puVar11[iVar5] == '\0') {
                if (puVar11[iVar5 - lVar2] == '\0') {
                  uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                  puVar9[iVar5] = uVar7;
                  img_row_3._4_4_ = iVar5;
                }
                else {
                  puVar9[iVar5] = puVar10[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
                }
              }
              else {
                puVar9[iVar5] = puVar10[img_row_3._4_4_];
                img_row_3._4_4_ = iVar5;
              }
            }
          }
          else {
            if (puVar11[img_row_3._4_4_ + 3] == '\0') {
              if (puVar8[img_row_3._4_4_ + 3] == '\0') {
                puVar9[iVar5] = puVar9[img_row_3._4_4_];
                img_row_3._4_4_ = iVar5;
                goto LAB_0032bf50;
              }
              if (puVar11[img_row_3._4_4_ + 4] == '\0') {
                puVar9[iVar5] = puVar9[img_row_3._4_4_];
                img_row_3._4_4_ = iVar5;
                goto LAB_00328d27;
              }
              if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
                uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],puVar9[img_row_3._4_4_]);
                puVar9[iVar5] = uVar7;
                img_row_3._4_4_ = iVar5;
              }
              else if (puVar11[iVar5] == '\0') {
                if (puVar11[iVar5 - lVar2] == '\0') {
                  uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                  puVar9[iVar5] = uVar7;
                  img_row_3._4_4_ = iVar5;
                }
                else {
                  puVar9[iVar5] = puVar10[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
                }
              }
              else {
                puVar9[iVar5] = puVar10[iVar5];
                img_row_3._4_4_ = iVar5;
              }
              goto LAB_003272c8;
            }
            if (puVar11[iVar5] == '\0') {
              if (puVar11[iVar5 - lVar2] == '\0') {
                uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
                puVar9[iVar5] = uVar7;
                img_row_3._4_4_ = iVar5;
              }
              else {
                puVar9[iVar5] = puVar10[img_row_3._4_4_];
                img_row_3._4_4_ = iVar5;
              }
            }
            else {
              puVar9[iVar5] = puVar10[iVar5];
              img_row_3._4_4_ = iVar5;
            }
          }
          goto LAB_0032ae39;
        }
        if ((int)(uVar1 - 2) < iVar5) {
          if (puVar8[iVar5] == '\0') {
            if (puVar12[iVar5] == '\0') {
              puVar9[iVar5] = 0;
            }
            else if (puVar12[img_row_3._4_4_ + 1] == '\0') {
              if (puVar8[img_row_3._4_4_ + 1] == '\0') {
                uVar7 = UF::NewLabel();
                puVar9[iVar5] = uVar7;
              }
              else {
                puVar9[iVar5] = puVar9[img_row_3._4_4_];
              }
            }
            else {
              puVar9[iVar5] = puVar9[img_row_3._4_4_];
            }
          }
          else if (puVar8[img_row_3._4_4_ + 1] == '\0') {
            if (puVar12[img_row_3._4_4_ + 1] == '\0') {
              if (puVar11[iVar5] == '\0') {
                puVar9[iVar5] = puVar10[img_row_3._4_4_];
              }
              else {
                puVar9[iVar5] = puVar10[iVar5];
              }
            }
            else {
              puVar9[iVar5] = puVar10[img_row_3._4_4_];
            }
          }
          else {
            puVar9[iVar5] = puVar9[img_row_3._4_4_];
          }
        }
        else if (puVar8[iVar5] == '\0') {
          if (puVar12[iVar5] == '\0') {
            if (puVar8[img_row_3._4_4_ + 3] == '\0') {
              if (puVar12[img_row_3._4_4_ + 3] == '\0') {
                puVar9[iVar5] = 0;
              }
              else {
                uVar7 = UF::NewLabel();
                puVar9[iVar5] = uVar7;
              }
            }
            else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
              if (puVar11[iVar5] == '\0') {
                uVar7 = UF::NewLabel();
                puVar9[iVar5] = uVar7;
              }
              else {
                puVar9[iVar5] = puVar10[iVar5];
              }
            }
            else {
              puVar9[iVar5] = puVar10[iVar5];
            }
          }
          else if (puVar8[img_row_3._4_4_ + 3] == '\0') {
            if (puVar12[img_row_3._4_4_ + 1] == '\0') {
              if (puVar8[img_row_3._4_4_ + 1] == '\0') {
                uVar7 = UF::NewLabel();
                puVar9[iVar5] = uVar7;
              }
              else {
                puVar9[iVar5] = puVar9[img_row_3._4_4_];
              }
            }
            else {
              puVar9[iVar5] = puVar9[img_row_3._4_4_];
            }
          }
          else if (puVar8[img_row_3._4_4_ + 1] == '\0') {
            if (puVar12[img_row_3._4_4_ + 1] == '\0') {
              if (puVar11[img_row_3._4_4_ + 3] == '\0') {
                if (puVar11[iVar5] == '\0') {
                  uVar7 = UF::NewLabel();
                  puVar9[iVar5] = uVar7;
                }
                else {
                  puVar9[iVar5] = puVar10[iVar5];
                }
              }
              else {
                puVar9[iVar5] = puVar10[iVar5];
              }
            }
            else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
              if (puVar11[iVar5] == '\0') {
                puVar9[iVar5] = puVar9[img_row_3._4_4_];
              }
              else {
                puVar9[iVar5] = puVar10[img_row_3._4_4_];
              }
            }
            else if (puVar11[iVar5] == '\0') {
              if (puVar11[iVar5 - lVar2] == '\0') {
                uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                puVar9[iVar5] = uVar7;
              }
              else {
                puVar9[iVar5] = puVar10[img_row_3._4_4_];
              }
            }
            else {
              puVar9[iVar5] = puVar10[img_row_3._4_4_];
            }
          }
          else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
            puVar9[iVar5] = puVar9[img_row_3._4_4_];
          }
          else if (puVar11[iVar5] == '\0') {
            if (puVar11[iVar5 - lVar2] == '\0') {
              uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
              puVar9[iVar5] = uVar7;
            }
            else {
              puVar9[iVar5] = puVar10[img_row_3._4_4_];
            }
          }
          else {
            puVar9[iVar5] = puVar10[iVar5];
          }
        }
        else if (puVar8[img_row_3._4_4_ + 1] == '\0') {
          if (puVar12[img_row_3._4_4_ + 1] == '\0') {
            if (puVar11[img_row_3._4_4_ + 3] == '\0') {
              if (puVar11[iVar5] == '\0') {
                puVar9[iVar5] = puVar10[img_row_3._4_4_];
              }
              else {
                puVar9[iVar5] = puVar10[iVar5];
              }
            }
            else if (puVar11[iVar5] == '\0') {
              if (puVar11[iVar5 - lVar2] == '\0') {
                uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
                puVar9[iVar5] = uVar7;
              }
              else {
                puVar9[iVar5] = puVar10[img_row_3._4_4_];
              }
            }
            else {
              puVar9[iVar5] = puVar10[iVar5];
            }
          }
          else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
            puVar9[iVar5] = puVar10[img_row_3._4_4_];
          }
          else if (puVar11[iVar5] == '\0') {
            if (puVar11[iVar5 - lVar2] == '\0') {
              uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
              puVar9[iVar5] = uVar7;
            }
            else {
              puVar9[iVar5] = puVar10[img_row_3._4_4_];
            }
          }
          else {
            puVar9[iVar5] = puVar10[img_row_3._4_4_];
          }
        }
        else if (puVar11[img_row_3._4_4_ + 3] == '\0') {
          puVar9[iVar5] = puVar9[img_row_3._4_4_];
        }
        else if (puVar11[iVar5] == '\0') {
          if (puVar11[iVar5 - lVar2] == '\0') {
            uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
            puVar9[iVar5] = uVar7;
          }
          else {
            puVar9[iVar5] = puVar10[img_row_3._4_4_];
          }
        }
        else {
          puVar9[iVar5] = puVar10[iVar5];
        }
      }
LAB_003316a4:
    }
    if ((this->o_rows & 1U) == 0) {
      return;
    }
    puVar8 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        uVar6 - 1);
    lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    lVar3 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48 -
            lVar2;
    puVar9 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,uVar6 - 1);
    lVar4 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                         field_0x48 -
            **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    local_bc = -2;
LAB_00331787:
    do {
      iVar5 = local_bc + 2;
      if ((int)(uVar1 - 2) <= iVar5) {
        if ((int)(uVar1 - 2) < iVar5) {
          if (puVar8[iVar5] == '\0') {
            puVar9[iVar5] = 0;
            return;
          }
          if (puVar8[iVar5 - lVar2] != '\0') {
            puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
            return;
          }
          uVar6 = UF::NewLabel();
          puVar9[iVar5] = uVar6;
          return;
        }
        if (puVar8[iVar5] == '\0') {
          if (puVar8[local_bc + 3] == '\0') {
            puVar9[iVar5] = 0;
            return;
          }
          if (puVar8[(local_bc + 3) - lVar2] != '\0') {
            puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
            return;
          }
          if (puVar8[iVar5 - lVar2] != '\0') {
            puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
            return;
          }
          uVar6 = UF::NewLabel();
          puVar9[iVar5] = uVar6;
          return;
        }
        if (puVar8[(local_bc + 3) - lVar2] != '\0') {
          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
          return;
        }
        if (puVar8[iVar5 - lVar2] != '\0') {
          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
          return;
        }
        uVar6 = UF::NewLabel();
        puVar9[iVar5] = uVar6;
        return;
      }
      if (puVar8[iVar5] == '\0') {
        if (puVar8[local_bc + 3] == '\0') {
          puVar9[iVar5] = 0;
          local_bc = iVar5;
          goto LAB_00331b9d;
        }
        if (puVar8[(local_bc + 3) - lVar2] != '\0') {
          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
          local_bc = iVar5;
          goto LAB_00332c33;
        }
        if (puVar8[(local_bc + 4) - lVar2] == '\0') {
          if (puVar8[iVar5 - lVar2] == '\0') {
            uVar6 = UF::NewLabel();
            puVar9[iVar5] = uVar6;
            local_bc = iVar5;
            goto LAB_0033223e;
          }
          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
          local_bc = iVar5;
          goto LAB_0033250f;
        }
        if (puVar8[iVar5 - lVar2] == '\0') {
          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4);
          local_bc = iVar5;
        }
        else if (puVar8[(local_bc + 3) + lVar3] == '\0') {
          uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4),
                            *(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4));
          puVar9[iVar5] = uVar6;
          local_bc = iVar5;
        }
        else {
          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
          local_bc = iVar5;
        }
      }
      else {
        if (puVar8[(local_bc + 3) - lVar2] != '\0') {
          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
          local_bc = iVar5;
          goto LAB_003330f2;
        }
        if (puVar8[local_bc + 3] == '\0') {
          if (puVar8[iVar5 - lVar2] == '\0') {
            uVar6 = UF::NewLabel();
            puVar9[iVar5] = uVar6;
            local_bc = iVar5;
          }
          else {
            puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
            local_bc = iVar5;
          }
          goto LAB_00331787;
        }
        if (puVar8[(local_bc + 4) - lVar2] == '\0') {
          if (puVar8[iVar5 - lVar2] == '\0') {
            uVar6 = UF::NewLabel();
            puVar9[iVar5] = uVar6;
            local_bc = iVar5;
            goto LAB_0033223e;
          }
          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
          local_bc = iVar5;
          goto LAB_0033250f;
        }
        if (puVar8[iVar5 - lVar2] == '\0') {
          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4);
          local_bc = iVar5;
        }
        else if (puVar8[(local_bc + 3) + lVar3] == '\0') {
          uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4),
                            *(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4));
          puVar9[iVar5] = uVar6;
          local_bc = iVar5;
        }
        else {
          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
          local_bc = iVar5;
        }
      }
LAB_00332933:
      iVar5 = local_bc + 2;
      if ((int)(uVar1 - 2) <= iVar5) {
        if (iVar5 <= (int)(uVar1 - 2)) {
          if (puVar8[iVar5] == '\0') {
            if (puVar8[local_bc + 3] == '\0') {
              puVar9[iVar5] = 0;
              return;
            }
            puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
            return;
          }
          if (puVar8[(local_bc + 3) - lVar2] == '\0') {
            puVar9[iVar5] = puVar9[local_bc];
            return;
          }
          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
          return;
        }
LAB_00333fa2:
        local_bc = iVar5;
        if (puVar8[local_bc] == '\0') {
          puVar9[local_bc] = 0;
          return;
        }
        puVar9[local_bc] = puVar9[local_bc + -2];
        return;
      }
      if (puVar8[iVar5] == '\0') {
        if (puVar8[local_bc + 3] == '\0') {
          puVar9[iVar5] = 0;
          local_bc = iVar5;
          goto LAB_00331b9d;
        }
        if (puVar8[(local_bc + 3) - lVar2] != '\0') {
          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
          local_bc = iVar5;
          goto LAB_00332c33;
        }
        if (puVar8[(local_bc + 4) - lVar2] == '\0') {
          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
          local_bc = iVar5;
LAB_0033250f:
          do {
            iVar5 = local_bc + 2;
            if ((int)(uVar1 - 2) <= iVar5) {
              if (iVar5 <= (int)(uVar1 - 2)) {
                if (puVar8[iVar5] == '\0') {
                  if (puVar8[local_bc + 3] == '\0') {
                    puVar9[iVar5] = 0;
                    return;
                  }
                  if (puVar8[(local_bc + 3) - lVar2] == '\0') {
                    uVar6 = UF::NewLabel();
                    puVar9[iVar5] = uVar6;
                    return;
                  }
                  puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                  return;
                }
                if (puVar8[(local_bc + 3) - lVar2] == '\0') {
                  puVar9[iVar5] = puVar9[local_bc];
                  return;
                }
                if (puVar8[iVar5 + lVar3] == '\0') {
                  uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4),
                                    puVar9[local_bc]);
                  puVar9[iVar5] = uVar6;
                  return;
                }
                if (puVar8[(local_bc + 1) + lVar3] == '\0') {
                  uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4),
                                    *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4));
                  puVar9[iVar5] = uVar6;
                  return;
                }
                puVar9[iVar5] = *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                return;
              }
              goto LAB_00333fa2;
            }
            if (puVar8[iVar5] != '\0') {
              if (puVar8[(local_bc + 3) - lVar2] != '\0') {
                if (puVar8[iVar5 + lVar3] == '\0') {
                  uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4),
                                    puVar9[local_bc]);
                  puVar9[iVar5] = uVar6;
                  local_bc = iVar5;
                  goto LAB_003330f2;
                }
                if (puVar8[(local_bc + 1) + lVar3] != '\0') {
                  puVar9[iVar5] = *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                  local_bc = iVar5;
                  goto LAB_003330f2;
                }
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4),
                                  *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4));
                puVar9[iVar5] = uVar6;
                local_bc = iVar5;
                goto LAB_003330f2;
              }
              if (puVar8[local_bc + 3] == '\0') {
                puVar9[iVar5] = puVar9[local_bc];
                local_bc = iVar5;
                goto LAB_00331787;
              }
              if (puVar8[(local_bc + 4) - lVar2] == '\0') {
                puVar9[iVar5] = puVar9[local_bc];
                local_bc = iVar5;
                goto LAB_0033395c;
              }
              if (puVar8[(local_bc + 3) + lVar3] == '\0') {
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4),
                                  puVar9[local_bc]);
                puVar9[iVar5] = uVar6;
                local_bc = iVar5;
              }
              else if (puVar8[iVar5 + lVar3] == '\0') {
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4),puVar9[local_bc]
                                 );
                puVar9[iVar5] = uVar6;
                local_bc = iVar5;
              }
              else if (puVar8[(local_bc + 1) + lVar3] == '\0') {
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4),
                                  *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4));
                puVar9[iVar5] = uVar6;
                local_bc = iVar5;
              }
              else {
                puVar9[iVar5] = *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                local_bc = iVar5;
              }
              goto LAB_00332933;
            }
            if (puVar8[local_bc + 3] != '\0') {
              if (puVar8[(local_bc + 3) - lVar2] != '\0') {
                puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                local_bc = iVar5;
                goto LAB_00332c33;
              }
              if (puVar8[(local_bc + 4) - lVar2] == '\0') {
                uVar6 = UF::NewLabel();
                puVar9[iVar5] = uVar6;
                local_bc = iVar5;
                goto LAB_0033223e;
              }
              puVar9[iVar5] = *(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4);
              local_bc = iVar5;
              goto LAB_00332933;
            }
            puVar9[iVar5] = 0;
            local_bc = iVar5;
LAB_00331b9d:
            iVar5 = local_bc + 2;
            if ((int)(uVar1 - 2) <= iVar5) {
              if ((int)(uVar1 - 2) < iVar5) {
                if (puVar8[iVar5] == '\0') {
                  puVar9[iVar5] = 0;
                  return;
                }
                if (puVar8[iVar5 - lVar2] == '\0') {
                  if (puVar8[(local_bc + 1) - lVar2] == '\0') {
                    uVar6 = UF::NewLabel();
                    puVar9[iVar5] = uVar6;
                    return;
                  }
                  puVar9[iVar5] = *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                  return;
                }
                puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                return;
              }
              if (puVar8[iVar5] == '\0') {
                if (puVar8[local_bc + 3] == '\0') {
                  puVar9[iVar5] = 0;
                  return;
                }
                if (puVar8[(local_bc + 3) - lVar2] == '\0') {
                  if (puVar8[iVar5 - lVar2] == '\0') {
                    uVar6 = UF::NewLabel();
                    puVar9[iVar5] = uVar6;
                    return;
                  }
                  puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                  return;
                }
                puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                return;
              }
              if (puVar8[(local_bc + 3) - lVar2] != '\0') {
                if (puVar8[iVar5 - lVar2] != '\0') {
                  puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                  return;
                }
                if (puVar8[(local_bc + 1) - lVar2] == '\0') {
                  puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                  return;
                }
                if (puVar8[iVar5 + lVar3] == '\0') {
                  uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4),
                                    *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4));
                  puVar9[iVar5] = uVar6;
                  return;
                }
                puVar9[iVar5] = *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                return;
              }
              if (puVar8[iVar5 - lVar2] != '\0') {
                puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                return;
              }
              if (puVar8[(local_bc + 1) - lVar2] == '\0') {
                uVar6 = UF::NewLabel();
                puVar9[iVar5] = uVar6;
                return;
              }
              puVar9[iVar5] = *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
              return;
            }
            if (puVar8[iVar5] == '\0') {
              if (puVar8[local_bc + 3] != '\0') {
                if (puVar8[(local_bc + 3) - lVar2] != '\0') {
                  puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                  local_bc = iVar5;
LAB_00332c33:
                  do {
                    iVar5 = local_bc + 2;
                    if ((int)(uVar1 - 2) <= iVar5) {
                      if (iVar5 <= (int)(uVar1 - 2)) {
                        if (puVar8[iVar5] == '\0') {
                          if (puVar8[local_bc + 3] == '\0') {
                            puVar9[iVar5] = 0;
                            return;
                          }
                          if (puVar8[(local_bc + 3) - lVar2] == '\0') {
                            if (puVar8[iVar5 - lVar2] == '\0') {
                              uVar6 = UF::NewLabel();
                              puVar9[iVar5] = uVar6;
                              return;
                            }
                            puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                            return;
                          }
                          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                          return;
                        }
                        if (puVar8[(local_bc + 3) - lVar2] == '\0') {
                          puVar9[iVar5] = puVar9[local_bc];
                          return;
                        }
                        if (puVar8[iVar5 - lVar2] == '\0') {
                          if (puVar8[iVar5 + lVar3] == '\0') {
                            uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4),
                                              puVar9[local_bc]);
                            puVar9[iVar5] = uVar6;
                            return;
                          }
                          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                          return;
                        }
                        puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                        return;
                      }
                      goto LAB_00333fa2;
                    }
                    if (puVar8[iVar5] != '\0') {
                      if (puVar8[(local_bc + 3) - lVar2] != '\0') {
                        if (puVar8[iVar5 - lVar2] != '\0') {
                          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                          local_bc = iVar5;
                          goto LAB_003330f2;
                        }
                        if (puVar8[iVar5 + lVar3] != '\0') {
                          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                          local_bc = iVar5;
                          goto LAB_003330f2;
                        }
                        uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4),
                                          puVar9[local_bc]);
                        puVar9[iVar5] = uVar6;
                        local_bc = iVar5;
                        goto LAB_003330f2;
                      }
                      if (puVar8[local_bc + 3] == '\0') {
                        puVar9[iVar5] = puVar9[local_bc];
                        local_bc = iVar5;
                        goto LAB_00331787;
                      }
                      if (puVar8[(local_bc + 4) - lVar2] == '\0') {
                        puVar9[iVar5] = puVar9[local_bc];
                        local_bc = iVar5;
                        goto LAB_0033395c;
                      }
                      if (puVar8[(local_bc + 3) + lVar3] == '\0') {
                        uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4)
                                          ,puVar9[local_bc]);
                        puVar9[iVar5] = uVar6;
                        local_bc = iVar5;
                      }
                      else if (puVar8[iVar5 - lVar2] == '\0') {
                        if (puVar8[iVar5 + lVar3] == '\0') {
                          uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4),
                                            puVar9[local_bc]);
                          puVar9[iVar5] = uVar6;
                          local_bc = iVar5;
                        }
                        else {
                          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                          local_bc = iVar5;
                        }
                      }
                      else {
                        puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                        local_bc = iVar5;
                      }
                      goto LAB_00332933;
                    }
                    if (puVar8[local_bc + 3] == '\0') {
                      puVar9[iVar5] = 0;
                      local_bc = iVar5;
                      goto LAB_00331b9d;
                    }
                    if (puVar8[(local_bc + 3) - lVar2] == '\0') {
                      if (puVar8[(local_bc + 4) - lVar2] == '\0') {
                        if (puVar8[iVar5 - lVar2] == '\0') {
                          uVar6 = UF::NewLabel();
                          puVar9[iVar5] = uVar6;
                          local_bc = iVar5;
LAB_0033223e:
                          do {
                            iVar5 = local_bc + 2;
                            if ((int)(uVar1 - 2) <= iVar5) {
                              if (iVar5 <= (int)(uVar1 - 2)) {
                                if (puVar8[iVar5] != '\0') {
                                  if (puVar8[(local_bc + 3) - lVar2] == '\0') {
                                    puVar9[iVar5] = puVar9[local_bc];
                                    return;
                                  }
                                  uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4
                                                             ),puVar9[local_bc]);
                                  puVar9[iVar5] = uVar6;
                                  return;
                                }
                                if (puVar8[local_bc + 3] != '\0') {
                                  if (puVar8[(local_bc + 3) - lVar2] == '\0') {
                                    uVar6 = UF::NewLabel();
                                    puVar9[iVar5] = uVar6;
                                    return;
                                  }
                                  puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                  return;
                                }
                                puVar9[iVar5] = 0;
                                return;
                              }
                              goto LAB_00333fa2;
                            }
                            if (puVar8[iVar5] == '\0') {
                              if (puVar8[local_bc + 3] == '\0') {
                                puVar9[iVar5] = 0;
                                local_bc = iVar5;
                                goto LAB_00331b9d;
                              }
                              if (puVar8[(local_bc + 3) - lVar2] != '\0') {
                                puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                local_bc = iVar5;
                                goto LAB_00332c33;
                              }
                              if (puVar8[(local_bc + 4) - lVar2] != '\0') {
                                puVar9[iVar5] =
                                     *(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4);
                                local_bc = iVar5;
                                goto LAB_00332933;
                              }
                              uVar6 = UF::NewLabel();
                              puVar9[iVar5] = uVar6;
                              local_bc = iVar5;
                              goto LAB_0033223e;
                            }
                            if (puVar8[(local_bc + 3) - lVar2] != '\0') {
                              uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4),
                                                puVar9[local_bc]);
                              puVar9[iVar5] = uVar6;
                              local_bc = iVar5;
                              goto LAB_003330f2;
                            }
                            if (puVar8[local_bc + 3] == '\0') {
                              puVar9[iVar5] = puVar9[local_bc];
                              local_bc = iVar5;
                              goto LAB_00331787;
                            }
                            if (puVar8[(local_bc + 4) - lVar2] != '\0') {
                              if (puVar8[(local_bc + 3) + lVar3] == '\0') {
                                uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                           (long)(local_bc + 4) * 4 + lVar4),
                                                  puVar9[local_bc]);
                                puVar9[iVar5] = uVar6;
                                local_bc = iVar5;
                              }
                              else {
                                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4),
                                                  puVar9[local_bc]);
                                puVar9[iVar5] = uVar6;
                                local_bc = iVar5;
                              }
                              goto LAB_00332933;
                            }
                            puVar9[iVar5] = puVar9[local_bc];
                            local_bc = iVar5;
LAB_0033395c:
                            while( true ) {
                              iVar5 = local_bc + 2;
                              if ((int)(uVar1 - 2) <= iVar5) {
                                if (iVar5 <= (int)(uVar1 - 2)) {
                                  if (puVar8[iVar5] == '\0') {
                                    if (puVar8[local_bc + 3] == '\0') {
                                      puVar9[iVar5] = 0;
                                      return;
                                    }
                                    if (puVar8[(local_bc + 3) - lVar2] == '\0') {
                                      uVar6 = UF::NewLabel();
                                      puVar9[iVar5] = uVar6;
                                      return;
                                    }
                                    puVar9[iVar5] =
                                         *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                    return;
                                  }
                                  if (puVar8[(local_bc + 3) - lVar2] == '\0') {
                                    puVar9[iVar5] = puVar9[local_bc];
                                    return;
                                  }
                                  if (puVar8[iVar5 + lVar3] == '\0') {
                                    uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                               (long)iVar5 * 4 + lVar4),
                                                      puVar9[local_bc]);
                                    puVar9[iVar5] = uVar6;
                                    return;
                                  }
                                  if (puVar8[local_bc - lVar2] == '\0') {
                                    uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                               (long)iVar5 * 4 + lVar4),
                                                      puVar9[local_bc]);
                                    puVar9[iVar5] = uVar6;
                                    return;
                                  }
                                  if (puVar8[(local_bc + 1) + lVar3] == '\0') {
                                    uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                               (long)local_bc * 4 + lVar4),
                                                      *(uint *)((long)puVar9 +
                                                               (long)iVar5 * 4 + lVar4));
                                    puVar9[iVar5] = uVar6;
                                    return;
                                  }
                                  puVar9[iVar5] =
                                       *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                                  return;
                                }
                                goto LAB_00333fa2;
                              }
                              if (puVar8[iVar5] == '\0') break;
                              if (puVar8[(local_bc + 3) - lVar2] == '\0') {
                                if (puVar8[local_bc + 3] == '\0') {
                                  puVar9[iVar5] = puVar9[local_bc];
                                  local_bc = iVar5;
                                  goto LAB_00331787;
                                }
                                if (puVar8[(local_bc + 4) - lVar2] != '\0') {
                                  if (puVar8[(local_bc + 3) + lVar3] == '\0') {
                                    uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                               (long)(local_bc + 4) * 4 + lVar4),
                                                      puVar9[local_bc]);
                                    puVar9[iVar5] = uVar6;
                                    local_bc = iVar5;
                                  }
                                  else if (puVar8[iVar5 + lVar3] == '\0') {
                                    uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                               (long)iVar5 * 4 + lVar4),
                                                      puVar9[local_bc]);
                                    puVar9[iVar5] = uVar6;
                                    local_bc = iVar5;
                                  }
                                  else if (puVar8[local_bc - lVar2] == '\0') {
                                    uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                               (long)iVar5 * 4 + lVar4),
                                                      puVar9[local_bc]);
                                    puVar9[iVar5] = uVar6;
                                    local_bc = iVar5;
                                  }
                                  else if (puVar8[(local_bc + 1) + lVar3] == '\0') {
                                    uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                               (long)local_bc * 4 + lVar4),
                                                      *(uint *)((long)puVar9 +
                                                               (long)iVar5 * 4 + lVar4));
                                    puVar9[iVar5] = uVar6;
                                    local_bc = iVar5;
                                  }
                                  else {
                                    puVar9[iVar5] =
                                         *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                                    local_bc = iVar5;
                                  }
                                  goto LAB_00332933;
                                }
                                puVar9[iVar5] = puVar9[local_bc];
                                local_bc = iVar5;
                              }
                              else {
                                if (puVar8[iVar5 + lVar3] == '\0') {
                                  uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4
                                                             ),puVar9[local_bc]);
                                  puVar9[iVar5] = uVar6;
                                  local_bc = iVar5;
                                }
                                else if (puVar8[local_bc - lVar2] == '\0') {
                                  uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4
                                                             ),puVar9[local_bc]);
                                  puVar9[iVar5] = uVar6;
                                  local_bc = iVar5;
                                }
                                else if (puVar8[(local_bc + 1) + lVar3] == '\0') {
                                  uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                             (long)local_bc * 4 + lVar4),
                                                    *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4
                                                             ));
                                  puVar9[iVar5] = uVar6;
                                  local_bc = iVar5;
                                }
                                else {
                                  puVar9[iVar5] =
                                       *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                                  local_bc = iVar5;
                                }
LAB_003330f2:
                                while( true ) {
                                  while( true ) {
                                    iVar5 = local_bc + 2;
                                    if ((int)(uVar1 - 2) <= iVar5) {
                                      if ((int)(uVar1 - 2) < iVar5) {
                                        if (puVar8[iVar5] == '\0') {
                                          puVar9[iVar5] = 0;
                                          return;
                                        }
                                        if (puVar8[local_bc + 1] == '\0') {
                                          if (puVar8[iVar5 - lVar2] == '\0') {
                                            puVar9[iVar5] =
                                                 *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4
                                                          );
                                            return;
                                          }
                                          puVar9[iVar5] =
                                               *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                          return;
                                        }
                                        puVar9[iVar5] = puVar9[local_bc];
                                        return;
                                      }
                                      if (puVar8[iVar5] == '\0') {
                                        if (puVar8[local_bc + 3] == '\0') {
                                          puVar9[iVar5] = 0;
                                          return;
                                        }
                                        if (puVar8[(local_bc + 3) - lVar2] == '\0') {
                                          if (puVar8[iVar5 - lVar2] == '\0') {
                                            uVar6 = UF::NewLabel();
                                            puVar9[iVar5] = uVar6;
                                            return;
                                          }
                                          puVar9[iVar5] =
                                               *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                          return;
                                        }
                                        puVar9[iVar5] =
                                             *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                        return;
                                      }
                                      if (puVar8[local_bc + 1] != '\0') {
                                        if (puVar8[(local_bc + 3) - lVar2] == '\0') {
                                          puVar9[iVar5] = puVar9[local_bc];
                                          return;
                                        }
                                        if (puVar8[iVar5 - lVar2] == '\0') {
                                          if (puVar8[iVar5 + lVar3] == '\0') {
                                            uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                                       (long)iVar5 * 4 + lVar4),
                                                              puVar9[local_bc]);
                                            puVar9[iVar5] = uVar6;
                                            return;
                                          }
                                          puVar9[iVar5] =
                                               *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                                          return;
                                        }
                                        puVar9[iVar5] =
                                             *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                        return;
                                      }
                                      if (puVar8[(local_bc + 3) - lVar2] == '\0') {
                                        if (puVar8[iVar5 - lVar2] == '\0') {
                                          puVar9[iVar5] =
                                               *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                                          return;
                                        }
                                        puVar9[iVar5] =
                                             *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                        return;
                                      }
                                      if (puVar8[iVar5 - lVar2] == '\0') {
                                        if (puVar8[iVar5 + lVar3] == '\0') {
                                          uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                                     (long)local_bc * 4 + lVar4),
                                                            *(uint *)((long)puVar9 +
                                                                     (long)iVar5 * 4 + lVar4));
                                          puVar9[iVar5] = uVar6;
                                          return;
                                        }
                                        puVar9[iVar5] =
                                             *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                                        return;
                                      }
                                      puVar9[iVar5] =
                                           *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                      return;
                                    }
                                    if (puVar8[iVar5] == '\0') {
                                      if (puVar8[local_bc + 3] == '\0') {
                                        puVar9[iVar5] = 0;
                                        local_bc = iVar5;
                                        goto LAB_00331b9d;
                                      }
                                      if (puVar8[(local_bc + 3) - lVar2] != '\0') {
                                        puVar9[iVar5] =
                                             *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                        local_bc = iVar5;
                                        goto LAB_00332c33;
                                      }
                                      if (puVar8[(local_bc + 4) - lVar2] != '\0') {
                                        if (puVar8[iVar5 - lVar2] == '\0') {
                                          puVar9[iVar5] =
                                               *(uint *)((long)puVar9 +
                                                        (long)(local_bc + 4) * 4 + lVar4);
                                          local_bc = iVar5;
                                        }
                                        else if (puVar8[(local_bc + 3) + lVar3] == '\0') {
                                          uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                                     (long)iVar5 * 4 + lVar4),
                                                            *(uint *)((long)puVar9 +
                                                                     (long)(local_bc + 4) * 4 +
                                                                     lVar4));
                                          puVar9[iVar5] = uVar6;
                                          local_bc = iVar5;
                                        }
                                        else {
                                          puVar9[iVar5] =
                                               *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                          local_bc = iVar5;
                                        }
                                        goto LAB_00332933;
                                      }
                                      if (puVar8[iVar5 - lVar2] == '\0') {
                                        uVar6 = UF::NewLabel();
                                        puVar9[iVar5] = uVar6;
                                        local_bc = iVar5;
                                        goto LAB_0033223e;
                                      }
                                      puVar9[iVar5] =
                                           *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                      local_bc = iVar5;
                                      goto LAB_0033250f;
                                    }
                                    if (puVar8[local_bc + 1] != '\0') break;
                                    if (puVar8[(local_bc + 3) - lVar2] == '\0') {
                                      if (puVar8[local_bc + 3] == '\0') {
                                        if (puVar8[iVar5 - lVar2] == '\0') {
                                          puVar9[iVar5] =
                                               *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                                          local_bc = iVar5;
                                        }
                                        else {
                                          puVar9[iVar5] =
                                               *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                          local_bc = iVar5;
                                        }
                                        goto LAB_00331787;
                                      }
                                      if (puVar8[(local_bc + 4) - lVar2] == '\0') {
                                        if (puVar8[iVar5 - lVar2] == '\0') {
                                          puVar9[iVar5] =
                                               *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                                          local_bc = iVar5;
                                          goto LAB_0033223e;
                                        }
                                        puVar9[iVar5] =
                                             *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                        local_bc = iVar5;
                                        goto LAB_0033250f;
                                      }
                                      if (puVar8[iVar5 - lVar2] == '\0') {
                                        if (puVar8[(local_bc + 3) + lVar3] == '\0') {
                                          uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                                     (long)local_bc * 4 + lVar4),
                                                            *(uint *)((long)puVar9 +
                                                                     (long)(local_bc + 4) * 4 +
                                                                     lVar4));
                                          puVar9[iVar5] = uVar6;
                                          local_bc = iVar5;
                                        }
                                        else if (puVar8[iVar5 + lVar3] == '\0') {
                                          uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                                     (long)local_bc * 4 + lVar4),
                                                            *(uint *)((long)puVar9 +
                                                                     (long)iVar5 * 4 + lVar4));
                                          puVar9[iVar5] = uVar6;
                                          local_bc = iVar5;
                                        }
                                        else {
                                          puVar9[iVar5] =
                                               *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                                          local_bc = iVar5;
                                        }
                                      }
                                      else if (puVar8[(local_bc + 3) + lVar3] == '\0') {
                                        uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                                   (long)iVar5 * 4 + lVar4),
                                                          *(uint *)((long)puVar9 +
                                                                   (long)(local_bc + 4) * 4 + lVar4)
                                                         );
                                        puVar9[iVar5] = uVar6;
                                        local_bc = iVar5;
                                      }
                                      else {
                                        puVar9[iVar5] =
                                             *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                        local_bc = iVar5;
                                      }
                                      goto LAB_00332933;
                                    }
                                    if (puVar8[iVar5 - lVar2] == '\0') {
                                      if (puVar8[iVar5 + lVar3] == '\0') {
                                        uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                                   (long)local_bc * 4 + lVar4),
                                                          *(uint *)((long)puVar9 +
                                                                   (long)iVar5 * 4 + lVar4));
                                        puVar9[iVar5] = uVar6;
                                        local_bc = iVar5;
                                      }
                                      else {
                                        puVar9[iVar5] =
                                             *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                                        local_bc = iVar5;
                                      }
                                    }
                                    else {
                                      puVar9[iVar5] =
                                           *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                      local_bc = iVar5;
                                    }
                                  }
                                  if (puVar8[(local_bc + 3) - lVar2] == '\0') break;
                                  if (puVar8[iVar5 - lVar2] == '\0') {
                                    if (puVar8[iVar5 + lVar3] == '\0') {
                                      uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                                 (long)iVar5 * 4 + lVar4),
                                                        puVar9[local_bc]);
                                      puVar9[iVar5] = uVar6;
                                      local_bc = iVar5;
                                    }
                                    else {
                                      puVar9[iVar5] =
                                           *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                                      local_bc = iVar5;
                                    }
                                  }
                                  else {
                                    puVar9[iVar5] =
                                         *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                    local_bc = iVar5;
                                  }
                                }
                                if (puVar8[local_bc + 3] == '\0') {
                                  puVar9[iVar5] = puVar9[local_bc];
                                  local_bc = iVar5;
                                  goto LAB_00331787;
                                }
                                if (puVar8[(local_bc + 4) - lVar2] != '\0') {
                                  if (puVar8[(local_bc + 3) + lVar3] == '\0') {
                                    uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                               (long)(local_bc + 4) * 4 + lVar4),
                                                      puVar9[local_bc]);
                                    puVar9[iVar5] = uVar6;
                                    local_bc = iVar5;
                                  }
                                  else if (puVar8[iVar5 - lVar2] == '\0') {
                                    if (puVar8[iVar5 + lVar3] == '\0') {
                                      uVar6 = UF::Merge(*(uint *)((long)puVar9 +
                                                                 (long)iVar5 * 4 + lVar4),
                                                        puVar9[local_bc]);
                                      puVar9[iVar5] = uVar6;
                                      local_bc = iVar5;
                                    }
                                    else {
                                      puVar9[iVar5] =
                                           *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                                      local_bc = iVar5;
                                    }
                                  }
                                  else {
                                    puVar9[iVar5] =
                                         *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                                    local_bc = iVar5;
                                  }
                                  goto LAB_00332933;
                                }
                                puVar9[iVar5] = puVar9[local_bc];
                                local_bc = iVar5;
                              }
                            }
                            if (puVar8[local_bc + 3] == '\0') {
                              puVar9[iVar5] = 0;
                              local_bc = iVar5;
                              goto LAB_00331b9d;
                            }
                            if (puVar8[(local_bc + 3) - lVar2] != '\0') goto code_r0x00333da5;
                            if (puVar8[(local_bc + 4) - lVar2] != '\0') {
                              puVar9[iVar5] =
                                   *(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4);
                              local_bc = iVar5;
                              goto LAB_00332933;
                            }
                            uVar6 = UF::NewLabel();
                            puVar9[iVar5] = uVar6;
                            local_bc = iVar5;
                          } while( true );
                        }
                        puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                        local_bc = iVar5;
                        goto LAB_0033250f;
                      }
                      if (puVar8[iVar5 - lVar2] == '\0') {
                        puVar9[iVar5] = *(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4);
                        local_bc = iVar5;
                      }
                      else if (puVar8[(local_bc + 3) + lVar3] == '\0') {
                        uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4),
                                          *(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4)
                                         );
                        puVar9[iVar5] = uVar6;
                        local_bc = iVar5;
                      }
                      else {
                        puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                        local_bc = iVar5;
                      }
                      goto LAB_00332933;
                    }
                    puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                    local_bc = iVar5;
                  } while( true );
                }
                if (puVar8[(local_bc + 4) - lVar2] == '\0') {
                  if (puVar8[iVar5 - lVar2] == '\0') {
                    uVar6 = UF::NewLabel();
                    puVar9[iVar5] = uVar6;
                    local_bc = iVar5;
                    goto LAB_0033223e;
                  }
                  puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                  local_bc = iVar5;
                  goto LAB_0033250f;
                }
                if (puVar8[iVar5 - lVar2] == '\0') {
                  puVar9[iVar5] = *(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4);
                  local_bc = iVar5;
                }
                else if (puVar8[(local_bc + 3) + lVar3] == '\0') {
                  uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4),
                                    *(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4));
                  puVar9[iVar5] = uVar6;
                  local_bc = iVar5;
                }
                else {
                  puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                  local_bc = iVar5;
                }
                goto LAB_00332933;
              }
              puVar9[iVar5] = 0;
              local_bc = iVar5;
              goto LAB_00331b9d;
            }
            if (puVar8[(local_bc + 3) - lVar2] != '\0') {
              if (puVar8[iVar5 - lVar2] != '\0') {
                puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                local_bc = iVar5;
                goto LAB_003330f2;
              }
              if (puVar8[(local_bc + 1) - lVar2] != '\0') {
                if (puVar8[iVar5 + lVar3] != '\0') {
                  puVar9[iVar5] = *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                  local_bc = iVar5;
                  goto LAB_003330f2;
                }
                uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4),
                                  *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4));
                puVar9[iVar5] = uVar6;
                local_bc = iVar5;
                goto LAB_003330f2;
              }
              puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
              local_bc = iVar5;
              goto LAB_003330f2;
            }
            if (puVar8[local_bc + 3] == '\0') {
              if (puVar8[iVar5 - lVar2] == '\0') {
                if (puVar8[(local_bc + 1) - lVar2] == '\0') {
                  uVar6 = UF::NewLabel();
                  puVar9[iVar5] = uVar6;
                  local_bc = iVar5;
                }
                else {
                  puVar9[iVar5] = *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                  local_bc = iVar5;
                }
              }
              else {
                puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
                local_bc = iVar5;
              }
              goto LAB_00331787;
            }
            if (puVar8[(local_bc + 4) - lVar2] != '\0') goto code_r0x00331d57;
            if (puVar8[iVar5 - lVar2] == '\0') {
              if (puVar8[(local_bc + 1) - lVar2] != '\0') {
                puVar9[iVar5] = *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
                local_bc = iVar5;
                goto LAB_0033223e;
              }
              uVar6 = UF::NewLabel();
              puVar9[iVar5] = uVar6;
              local_bc = iVar5;
              goto LAB_0033223e;
            }
            puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
            local_bc = iVar5;
          } while( true );
        }
        if (puVar8[(local_bc + 3) + lVar3] == '\0') {
          uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4),
                            *(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4));
          puVar9[iVar5] = uVar6;
          local_bc = iVar5;
        }
        else {
          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
          local_bc = iVar5;
        }
        goto LAB_00332933;
      }
      if (puVar8[(local_bc + 3) - lVar2] != '\0') {
        puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
        local_bc = iVar5;
        goto LAB_003330f2;
      }
      if (puVar8[local_bc + 3] != '\0') {
        if (puVar8[(local_bc + 4) - lVar2] == '\0') {
          puVar9[iVar5] = puVar9[local_bc];
          local_bc = iVar5;
          goto LAB_0033395c;
        }
        if (puVar8[(local_bc + 3) + lVar3] == '\0') {
          uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4),
                            puVar9[local_bc]);
          puVar9[iVar5] = uVar6;
          local_bc = iVar5;
        }
        else {
          puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
          local_bc = iVar5;
        }
        goto LAB_00332933;
      }
      puVar9[iVar5] = puVar9[local_bc];
      local_bc = iVar5;
    } while( true );
  }
  puVar8 = cv::Mat::ptr<unsigned_char>
                     (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
  puVar9 = cv::Mat::ptr<unsigned_int>
                     (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,0
                     );
  img_row_1._4_4_ = -2;
LAB_0032428b:
  do {
    iVar5 = img_row_1._4_4_ + 2;
    if ((int)(uVar1 - 2) <= iVar5) {
      if ((int)(uVar1 - 2) < iVar5) {
        if (puVar8[iVar5] == '\0') {
          puVar9[iVar5] = 0;
        }
        else {
          uVar6 = UF::NewLabel();
          puVar9[iVar5] = uVar6;
        }
      }
      else if (puVar8[iVar5] == '\0') {
        if (puVar8[img_row_1._4_4_ + 3] == '\0') {
          puVar9[iVar5] = 0;
        }
        else {
          uVar6 = UF::NewLabel();
          puVar9[iVar5] = uVar6;
        }
      }
      else if (puVar8[img_row_1._4_4_ + 3] == '\0') {
        uVar6 = UF::NewLabel();
        puVar9[iVar5] = uVar6;
      }
      else {
        uVar6 = UF::NewLabel();
        puVar9[iVar5] = uVar6;
      }
      return;
    }
    if (puVar8[iVar5] != '\0') {
      if (puVar8[img_row_1._4_4_ + 3] == '\0') {
        uVar6 = UF::NewLabel();
        puVar9[iVar5] = uVar6;
        img_row_1._4_4_ = iVar5;
      }
      else {
        uVar6 = UF::NewLabel();
        puVar9[iVar5] = uVar6;
        img_row_1._4_4_ = iVar5;
LAB_00324342:
        while( true ) {
          while( true ) {
            iVar5 = img_row_1._4_4_ + 2;
            if ((int)(uVar1 - 2) <= iVar5) {
              if ((int)(uVar1 - 2) < iVar5) {
                if (puVar8[iVar5] == '\0') {
                  puVar9[iVar5] = 0;
                  return;
                }
                puVar9[iVar5] = puVar9[img_row_1._4_4_];
                return;
              }
              if (puVar8[iVar5] != '\0') {
                if (puVar8[img_row_1._4_4_ + 3] == '\0') {
                  puVar9[iVar5] = puVar9[img_row_1._4_4_];
                  return;
                }
                puVar9[iVar5] = puVar9[img_row_1._4_4_];
                return;
              }
              if (puVar8[img_row_1._4_4_ + 3] == '\0') {
                puVar9[iVar5] = 0;
                return;
              }
              uVar6 = UF::NewLabel();
              puVar9[iVar5] = uVar6;
              return;
            }
            if (puVar8[iVar5] == '\0') break;
            if (puVar8[img_row_1._4_4_ + 3] == '\0') {
              puVar9[iVar5] = puVar9[img_row_1._4_4_];
              img_row_1._4_4_ = iVar5;
              goto LAB_0032428b;
            }
            puVar9[iVar5] = puVar9[img_row_1._4_4_];
            img_row_1._4_4_ = iVar5;
          }
          if (puVar8[img_row_1._4_4_ + 3] == '\0') break;
          uVar6 = UF::NewLabel();
          puVar9[iVar5] = uVar6;
          img_row_1._4_4_ = iVar5;
        }
        puVar9[iVar5] = 0;
        img_row_1._4_4_ = iVar5;
      }
      goto LAB_0032428b;
    }
    if (puVar8[img_row_1._4_4_ + 3] != '\0') {
      uVar6 = UF::NewLabel();
      puVar9[iVar5] = uVar6;
      img_row_1._4_4_ = iVar5;
      goto LAB_00324342;
    }
    puVar9[iVar5] = 0;
    img_row_1._4_4_ = iVar5;
  } while( true );
code_r0x00328eea:
  if (puVar11[(img_row_3._4_4_ + 3) - lVar2] == '\0') {
    uVar7 = UF::Merge(puVar10[img_row_3._4_4_ + 4],puVar9[img_row_3._4_4_]);
    puVar9[iVar5] = uVar7;
    img_row_3._4_4_ = iVar5;
  }
  else if (puVar11[iVar5 - lVar2] == '\0') {
    uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
    puVar9[iVar5] = uVar7;
    img_row_3._4_4_ = iVar5;
  }
  else if (puVar11[img_row_3._4_4_] == '\0') {
    uVar7 = UF::Merge(puVar10[iVar5],puVar9[img_row_3._4_4_]);
    puVar9[iVar5] = uVar7;
    img_row_3._4_4_ = iVar5;
  }
  else if (puVar11[(img_row_3._4_4_ + 1) - lVar2] == '\0') {
    uVar7 = UF::Merge(puVar10[img_row_3._4_4_],puVar10[iVar5]);
    puVar9[iVar5] = uVar7;
    img_row_3._4_4_ = iVar5;
  }
  else {
    puVar9[iVar5] = puVar10[img_row_3._4_4_];
    img_row_3._4_4_ = iVar5;
  }
  goto LAB_003272c8;
LAB_003267fa:
  puVar9[iVar5] = 0;
  img_row_3._4_4_ = iVar5;
  goto LAB_003256b5;
code_r0x00331d57:
  if (puVar8[iVar5 - lVar2] == '\0') {
    if (puVar8[(local_bc + 1) - lVar2] == '\0') {
      puVar9[iVar5] = *(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4);
      local_bc = iVar5;
    }
    else if (puVar8[(local_bc + 3) + lVar3] == '\0') {
      uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4),
                        *(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4));
      puVar9[iVar5] = uVar6;
      local_bc = iVar5;
    }
    else if (puVar8[iVar5 + lVar3] == '\0') {
      uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4),
                        *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4));
      puVar9[iVar5] = uVar6;
      local_bc = iVar5;
    }
    else {
      puVar9[iVar5] = *(uint *)((long)puVar9 + (long)local_bc * 4 + lVar4);
      local_bc = iVar5;
    }
  }
  else if (puVar8[(local_bc + 3) + lVar3] == '\0') {
    uVar6 = UF::Merge(*(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4),
                      *(uint *)((long)puVar9 + (long)(local_bc + 4) * 4 + lVar4));
    puVar9[iVar5] = uVar6;
    local_bc = iVar5;
  }
  else {
    puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
    local_bc = iVar5;
  }
  goto LAB_00332933;
code_r0x00333da5:
  puVar9[iVar5] = *(uint *)((long)puVar9 + (long)iVar5 * 4 + lVar4);
  local_bc = iVar5;
  goto LAB_00332c33;
}

Assistant:

void FirstScan()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        e_rows = h & 0xfffffffe;
        o_rows = h % 2 == 1;
        e_cols = w & 0xfffffffe;
        o_cols = w % 2 == 1;

        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan

        // Define Conditions and Actions
        {
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

            // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
                               // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
                               //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
                               // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
                               // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
                               // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
                               // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
                               //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
                               // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
                               // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
                               // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
                               // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
                               // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
                               // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
                               //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
                               //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
        }

        if (h == 1) {
            // Single line
            int r = 0;
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
            int c = -2;
#include "labeling_tagliatelle_2021_sl_forest.inc.h"
        }
        else {
            // More than one line

            // First couple of lines
            {
                int r = 0;
                const unsigned char* const img_row = img_.ptr<unsigned char>(0);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
                int c = -2;

#include "labeling_tagliatelle_2021_fl_forest.inc.h"
            }

            // Every other line but the last one if image has an odd number of rows
            for (int r = 2; r < e_rows; r += 2) {
                // Get rows pointer
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

                int c = -2;
                goto cl_tree_0;

#include "labeling_tagliatelle_2021_cl_forest.inc.h"
            }

            // Last line (in case the rows are odd)
            if (o_rows)
            {
                int r = h - 1;
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
                int c = -2;
#include "labeling_tagliatelle_2021_ll_forest.inc.h"
            }
        }


        // Undef Conditions and Actions
        {
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
        }
    }